

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  bool bVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  uint uVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar58;
  ulong uVar59;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  float fVar63;
  undefined4 uVar64;
  float fVar65;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  vint4 bi_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar85 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar96 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar121;
  float fVar122;
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar123;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar158;
  float fVar160;
  vint4 bi;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar162;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar159;
  float fVar161;
  float fVar163;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined8 uVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar179;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  float fVar181;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  vint4 ai_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar201 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  vfloat4 a0_3;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar221;
  float fVar232;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  float fVar243;
  float fVar251;
  float fVar252;
  vfloat4 a0;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar253;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar254;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar264;
  undefined1 auVar255 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar268 [16];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar273 [16];
  undefined1 auVar277 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4c8 [16];
  int local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  undefined4 uStack_44c;
  undefined1 local_448 [32];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  ulong local_410;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  undefined1 local_338 [16];
  RTCFilterFunctionNArguments local_328;
  uint auStack_2f8 [4];
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2dc;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  uint local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar57;
  undefined1 auVar118 [32];
  
  PVar3 = prim[1];
  uVar59 = (ulong)(byte)PVar3;
  fVar140 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar66._0_4_ = fVar140 * auVar12._0_4_;
  auVar66._4_4_ = fVar140 * auVar12._4_4_;
  auVar66._8_4_ = fVar140 * auVar12._8_4_;
  auVar66._12_4_ = fVar140 * auVar12._12_4_;
  auVar142._0_4_ = fVar140 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar142._4_4_ = fVar140 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar142._8_4_ = fVar140 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar142._12_4_ = fVar140 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar267 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar267 = vcvtdq2ps_avx(auVar267);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar59 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar56 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar59 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar56 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar265._4_4_ = auVar142._0_4_;
  auVar265._0_4_ = auVar142._0_4_;
  auVar265._8_4_ = auVar142._0_4_;
  auVar265._12_4_ = auVar142._0_4_;
  auVar83 = vshufps_avx(auVar142,auVar142,0x55);
  auVar67 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar140 = auVar67._0_4_;
  auVar233._0_4_ = fVar140 * auVar267._0_4_;
  fVar159 = auVar67._4_4_;
  auVar233._4_4_ = fVar159 * auVar267._4_4_;
  fVar161 = auVar67._8_4_;
  auVar233._8_4_ = fVar161 * auVar267._8_4_;
  fVar163 = auVar67._12_4_;
  auVar233._12_4_ = fVar163 * auVar267._12_4_;
  auVar222._0_4_ = auVar11._0_4_ * fVar140;
  auVar222._4_4_ = auVar11._4_4_ * fVar159;
  auVar222._8_4_ = auVar11._8_4_ * fVar161;
  auVar222._12_4_ = auVar11._12_4_ * fVar163;
  auVar197._0_4_ = auVar95._0_4_ * fVar140;
  auVar197._4_4_ = auVar95._4_4_ * fVar159;
  auVar197._8_4_ = auVar95._8_4_ * fVar161;
  auVar197._12_4_ = auVar95._12_4_ * fVar163;
  auVar67 = vfmadd231ps_fma(auVar233,auVar83,auVar8);
  auVar204 = vfmadd231ps_fma(auVar222,auVar83,auVar10);
  auVar83 = vfmadd231ps_fma(auVar197,auVar68,auVar83);
  auVar109 = vfmadd231ps_fma(auVar67,auVar265,auVar12);
  auVar204 = vfmadd231ps_fma(auVar204,auVar265,auVar9);
  auVar125 = vfmadd231ps_fma(auVar83,auVar69,auVar265);
  auVar266._4_4_ = auVar66._0_4_;
  auVar266._0_4_ = auVar66._0_4_;
  auVar266._8_4_ = auVar66._0_4_;
  auVar266._12_4_ = auVar66._0_4_;
  auVar83 = vshufps_avx(auVar66,auVar66,0x55);
  auVar67 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar140 = auVar67._0_4_;
  auVar143._0_4_ = fVar140 * auVar267._0_4_;
  fVar159 = auVar67._4_4_;
  auVar143._4_4_ = fVar159 * auVar267._4_4_;
  fVar161 = auVar67._8_4_;
  auVar143._8_4_ = fVar161 * auVar267._8_4_;
  fVar163 = auVar67._12_4_;
  auVar143._12_4_ = fVar163 * auVar267._12_4_;
  auVar130._0_4_ = auVar11._0_4_ * fVar140;
  auVar130._4_4_ = auVar11._4_4_ * fVar159;
  auVar130._8_4_ = auVar11._8_4_ * fVar161;
  auVar130._12_4_ = auVar11._12_4_ * fVar163;
  auVar67._0_4_ = auVar95._0_4_ * fVar140;
  auVar67._4_4_ = auVar95._4_4_ * fVar159;
  auVar67._8_4_ = auVar95._8_4_ * fVar161;
  auVar67._12_4_ = auVar95._12_4_ * fVar163;
  auVar8 = vfmadd231ps_fma(auVar143,auVar83,auVar8);
  auVar267 = vfmadd231ps_fma(auVar130,auVar83,auVar10);
  auVar10 = vfmadd231ps_fma(auVar67,auVar83,auVar68);
  auVar11 = vfmadd231ps_fma(auVar8,auVar266,auVar12);
  auVar68 = vfmadd231ps_fma(auVar267,auVar266,auVar9);
  auVar95 = vfmadd231ps_fma(auVar10,auVar266,auVar69);
  local_338._8_4_ = 0x7fffffff;
  local_338._0_8_ = 0x7fffffff7fffffff;
  local_338._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar109,local_338);
  auVar124._8_4_ = 0x219392ef;
  auVar124._0_8_ = 0x219392ef219392ef;
  auVar124._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar124,1);
  auVar8 = vblendvps_avx(auVar109,auVar124,auVar12);
  auVar12 = vandps_avx(auVar204,local_338);
  auVar12 = vcmpps_avx(auVar12,auVar124,1);
  auVar267 = vblendvps_avx(auVar204,auVar124,auVar12);
  auVar12 = vandps_avx(auVar125,local_338);
  auVar12 = vcmpps_avx(auVar12,auVar124,1);
  auVar12 = vblendvps_avx(auVar125,auVar124,auVar12);
  auVar9 = vrcpps_avx(auVar8);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = &DAT_3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar182);
  auVar9 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8 = vrcpps_avx(auVar267);
  auVar267 = vfnmadd213ps_fma(auVar267,auVar8,auVar182);
  auVar10 = vfmadd132ps_fma(auVar267,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar8,auVar182);
  auVar69 = vfmadd132ps_fma(auVar12,auVar8,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar125._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar125._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar125._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar125._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar8);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar11);
  auVar144._0_4_ = auVar9._0_4_ * auVar12._0_4_;
  auVar144._4_4_ = auVar9._4_4_ * auVar12._4_4_;
  auVar144._8_4_ = auVar9._8_4_ * auVar12._8_4_;
  auVar144._12_4_ = auVar9._12_4_ * auVar12._12_4_;
  auVar204._1_3_ = 0;
  auVar204[0] = PVar3;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar267);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar59 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar68);
  auVar198._0_4_ = auVar12._0_4_ * auVar10._0_4_;
  auVar198._4_4_ = auVar12._4_4_ * auVar10._4_4_;
  auVar198._8_4_ = auVar12._8_4_ * auVar10._8_4_;
  auVar198._12_4_ = auVar12._12_4_ * auVar10._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar8);
  auVar12 = vsubps_avx(auVar12,auVar68);
  auVar83._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar83._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar83._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar83._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar56 + uVar59 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar95);
  auVar109._0_4_ = auVar69._0_4_ * auVar12._0_4_;
  auVar109._4_4_ = auVar69._4_4_ * auVar12._4_4_;
  auVar109._8_4_ = auVar69._8_4_ * auVar12._8_4_;
  auVar109._12_4_ = auVar69._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar95);
  auVar68._0_4_ = auVar69._0_4_ * auVar12._0_4_;
  auVar68._4_4_ = auVar69._4_4_ * auVar12._4_4_;
  auVar68._8_4_ = auVar69._8_4_ * auVar12._8_4_;
  auVar68._12_4_ = auVar69._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar125,auVar144);
  auVar8 = vpminsd_avx(auVar198,auVar83);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vpminsd_avx(auVar109,auVar68);
  uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar213._4_4_ = uVar64;
  auVar213._0_4_ = uVar64;
  auVar213._8_4_ = uVar64;
  auVar213._12_4_ = uVar64;
  auVar8 = vmaxps_avx(auVar8,auVar213);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  local_2b8._0_4_ = auVar12._0_4_ * 0.99999964;
  local_2b8._4_4_ = auVar12._4_4_ * 0.99999964;
  local_2b8._8_4_ = auVar12._8_4_ * 0.99999964;
  local_2b8._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar125,auVar144);
  auVar8 = vpmaxsd_avx(auVar198,auVar83);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar8 = vpmaxsd_avx(auVar109,auVar68);
  fVar140 = (ray->super_RayK<1>).tfar;
  auVar95._4_4_ = fVar140;
  auVar95._0_4_ = fVar140;
  auVar95._8_4_ = fVar140;
  auVar95._12_4_ = fVar140;
  auVar8 = vminps_avx(auVar8,auVar95);
  auVar12 = vminps_avx(auVar12,auVar8);
  auVar69._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar69._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar69._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar69._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar204[4] = PVar3;
  auVar204._5_3_ = 0;
  auVar204[8] = PVar3;
  auVar204._9_3_ = 0;
  auVar204[0xc] = PVar3;
  auVar204._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar204,_DAT_01ff0cf0);
  auVar12 = vcmpps_avx(local_2b8,auVar69,2);
  auVar12 = vandps_avx(auVar12,auVar8);
  uVar53 = vmovmskps_avx(auVar12);
  if (uVar53 == 0) {
    return;
  }
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  uVar53 = uVar53 & 0xff;
  local_1f8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_348 = 0x80000000;
  uStack_344 = 0x80000000;
  uStack_340 = 0x80000000;
  uStack_33c = 0x80000000;
LAB_01650d6e:
  lVar58 = 0;
  uVar59 = (ulong)uVar53;
  for (uVar56 = uVar59; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar53 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar53].ptr;
  local_410 = (ulong)*(uint *)(prim + lVar58 * 4 + 6);
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar58 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var7 + uVar56 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar56 + 1) * (long)pvVar6);
  auVar267 = *(undefined1 (*) [16])(_Var7 + (uVar56 + 2) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (long)pvVar6 * (uVar56 + 3));
  lVar58 = *(long *)&pGVar4[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar58 + (long)p_Var5 * uVar56);
  auVar11 = *(undefined1 (*) [16])(lVar58 + (long)p_Var5 * (uVar56 + 1));
  auVar69 = *(undefined1 (*) [16])(lVar58 + (long)p_Var5 * (uVar56 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  auVar68 = *(undefined1 (*) [16])(lVar58 + (long)p_Var5 * (uVar56 + 3));
  if (uVar59 != 0) {
    uVar62 = uVar59 - 1 & uVar59;
    for (uVar56 = uVar59; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar204 = ZEXT816(0) << 0x40;
  auVar70._0_4_ = auVar68._0_4_ * 0.0;
  auVar70._4_4_ = auVar68._4_4_ * 0.0;
  auVar70._8_4_ = auVar68._8_4_ * 0.0;
  auVar70._12_4_ = auVar68._12_4_ * 0.0;
  auVar83 = vfmadd231ps_fma(auVar70,auVar69,auVar204);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar83);
  local_428._0_4_ = auVar10._0_4_ + auVar95._0_4_;
  local_428._4_4_ = auVar10._4_4_ + auVar95._4_4_;
  fStack_420 = auVar10._8_4_ + auVar95._8_4_;
  fStack_41c = auVar10._12_4_ + auVar95._12_4_;
  auVar255._8_4_ = 0x40400000;
  auVar255._0_8_ = 0x4040000040400000;
  auVar255._12_4_ = 0x40400000;
  auVar95 = vfmadd231ps_fma(auVar83,auVar11,auVar255);
  auVar67 = vfnmadd231ps_fma(auVar95,auVar10,auVar255);
  auVar234._0_4_ = auVar9._0_4_ * 0.0;
  auVar234._4_4_ = auVar9._4_4_ * 0.0;
  auVar234._8_4_ = auVar9._8_4_ * 0.0;
  auVar234._12_4_ = auVar9._12_4_ * 0.0;
  auVar83 = vfmadd231ps_fma(auVar234,auVar267,auVar204);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar8,auVar83);
  auVar244._0_4_ = auVar12._0_4_ + auVar95._0_4_;
  auVar244._4_4_ = auVar12._4_4_ + auVar95._4_4_;
  auVar244._8_4_ = auVar12._8_4_ + auVar95._8_4_;
  auVar244._12_4_ = auVar12._12_4_ + auVar95._12_4_;
  auVar95 = vfmadd231ps_fma(auVar83,auVar8,auVar255);
  auVar83 = vfnmadd231ps_fma(auVar95,auVar12,auVar255);
  auVar95 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar69,auVar68);
  auVar95 = vfmadd231ps_fma(auVar95,auVar11,auVar204);
  auVar95 = vfmadd231ps_fma(auVar95,auVar10,auVar204);
  auVar110._0_4_ = auVar68._0_4_ * 3.0;
  auVar110._4_4_ = auVar68._4_4_ * 3.0;
  auVar110._8_4_ = auVar68._8_4_ * 3.0;
  auVar110._12_4_ = auVar68._12_4_ * 3.0;
  auVar69 = vfnmadd231ps_fma(auVar110,auVar255,auVar69);
  auVar11 = vfmadd231ps_fma(auVar69,auVar204,auVar11);
  auVar69 = vfnmadd231ps_fma(auVar11,auVar204,auVar10);
  auVar10 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar267,auVar9);
  auVar10 = vfmadd231ps_fma(auVar10,auVar8,auVar204);
  auVar10 = vfmadd231ps_fma(auVar10,auVar12,auVar204);
  auVar214._0_4_ = auVar9._0_4_ * 3.0;
  auVar214._4_4_ = auVar9._4_4_ * 3.0;
  auVar214._8_4_ = auVar9._8_4_ * 3.0;
  auVar214._12_4_ = auVar9._12_4_ * 3.0;
  auVar267 = vfnmadd231ps_fma(auVar214,auVar255,auVar267);
  auVar8 = vfmadd231ps_fma(auVar267,auVar204,auVar8);
  auVar11 = vfnmadd231ps_fma(auVar8,auVar204,auVar12);
  auVar12 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar8 = vshufps_avx(auVar244,auVar244,0xc9);
  fVar63 = auVar67._0_4_;
  auVar145._0_4_ = fVar63 * auVar8._0_4_;
  fVar65 = auVar67._4_4_;
  auVar145._4_4_ = fVar65 * auVar8._4_4_;
  fVar141 = auVar67._8_4_;
  auVar145._8_4_ = fVar141 * auVar8._8_4_;
  fVar179 = auVar67._12_4_;
  auVar145._12_4_ = fVar179 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar145,auVar12,auVar244);
  auVar267 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar146._0_4_ = fVar63 * auVar8._0_4_;
  auVar146._4_4_ = fVar65 * auVar8._4_4_;
  auVar146._8_4_ = fVar141 * auVar8._8_4_;
  auVar146._12_4_ = fVar179 * auVar8._12_4_;
  auVar12 = vfmsub231ps_fma(auVar146,auVar12,auVar83);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar8 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar108 = auVar69._0_4_;
  auVar126._0_4_ = fVar108 * auVar8._0_4_;
  fVar121 = auVar69._4_4_;
  auVar126._4_4_ = fVar121 * auVar8._4_4_;
  fVar122 = auVar69._8_4_;
  auVar126._8_4_ = fVar122 * auVar8._8_4_;
  fVar123 = auVar69._12_4_;
  auVar126._12_4_ = fVar123 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar126,auVar12,auVar10);
  auVar10 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar165._0_4_ = fVar108 * auVar8._0_4_;
  auVar165._4_4_ = fVar121 * auVar8._4_4_;
  auVar165._8_4_ = fVar122 * auVar8._8_4_;
  auVar165._12_4_ = fVar123 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar165,auVar12,auVar11);
  auVar12 = vdpps_avx(auVar267,auVar267,0x7f);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  fVar159 = auVar12._0_4_;
  auVar215._4_12_ = ZEXT812(0) << 0x20;
  auVar215._0_4_ = fVar159;
  auVar8 = vrsqrtss_avx(auVar215,auVar215);
  fVar140 = auVar8._0_4_;
  auVar8 = vdpps_avx(auVar267,auVar9,0x7f);
  fVar161 = fVar140 * 1.5 - fVar159 * 0.5 * fVar140 * fVar140 * fVar140;
  fVar139 = fVar161 * auVar267._0_4_;
  fVar158 = fVar161 * auVar267._4_4_;
  fVar160 = fVar161 * auVar267._8_4_;
  fVar162 = fVar161 * auVar267._12_4_;
  auVar223._0_4_ = auVar9._0_4_ * fVar159;
  auVar223._4_4_ = auVar9._4_4_ * fVar159;
  auVar223._8_4_ = auVar9._8_4_ * fVar159;
  auVar223._12_4_ = auVar9._12_4_ * fVar159;
  fVar140 = auVar8._0_4_;
  auVar183._0_4_ = fVar140 * auVar267._0_4_;
  auVar183._4_4_ = fVar140 * auVar267._4_4_;
  auVar183._8_4_ = fVar140 * auVar267._8_4_;
  auVar183._12_4_ = fVar140 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar223,auVar183);
  auVar8 = vrcpss_avx(auVar215,auVar215);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar140 = auVar8._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar159 = auVar12._0_4_;
  auVar199._4_12_ = ZEXT812(0) << 0x20;
  auVar199._0_4_ = fVar159;
  auVar8 = vrsqrtss_avx(auVar199,auVar199);
  fVar163 = auVar8._0_4_;
  fVar163 = fVar163 * 1.5 - fVar159 * 0.5 * fVar163 * fVar163 * fVar163;
  fVar243 = fVar163 * auVar10._0_4_;
  fVar251 = fVar163 * auVar10._4_4_;
  fVar252 = fVar163 * auVar10._8_4_;
  fVar253 = fVar163 * auVar10._12_4_;
  auVar8 = vdpps_avx(auVar10,auVar11,0x7f);
  auVar166._0_4_ = fVar159 * auVar11._0_4_;
  auVar166._4_4_ = fVar159 * auVar11._4_4_;
  auVar166._8_4_ = fVar159 * auVar11._8_4_;
  auVar166._12_4_ = fVar159 * auVar11._12_4_;
  fVar159 = auVar8._0_4_;
  auVar127._0_4_ = fVar159 * auVar10._0_4_;
  auVar127._4_4_ = fVar159 * auVar10._4_4_;
  auVar127._8_4_ = fVar159 * auVar10._8_4_;
  auVar127._12_4_ = fVar159 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar166,auVar127);
  auVar8 = vrcpss_avx(auVar199,auVar199);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar159 = auVar12._0_4_ * auVar8._0_4_;
  auVar12 = vshufps_avx(_local_428,_local_428,0xff);
  auVar200._0_4_ = auVar12._0_4_ * fVar139;
  auVar200._4_4_ = auVar12._4_4_ * fVar158;
  auVar200._8_4_ = auVar12._8_4_ * fVar160;
  auVar200._12_4_ = auVar12._12_4_ * fVar162;
  local_358 = vsubps_avx(_local_428,auVar200);
  auVar8 = vshufps_avx(auVar67,auVar67,0xff);
  auVar147._0_4_ = auVar8._0_4_ * fVar139 + auVar12._0_4_ * fVar161 * fVar140 * auVar267._0_4_;
  auVar147._4_4_ = auVar8._4_4_ * fVar158 + auVar12._4_4_ * fVar161 * fVar140 * auVar267._4_4_;
  auVar147._8_4_ = auVar8._8_4_ * fVar160 + auVar12._8_4_ * fVar161 * fVar140 * auVar267._8_4_;
  auVar147._12_4_ = auVar8._12_4_ * fVar162 + auVar12._12_4_ * fVar161 * fVar140 * auVar267._12_4_;
  auVar267 = vsubps_avx(auVar67,auVar147);
  local_368._0_4_ = auVar200._0_4_ + (float)local_428._0_4_;
  local_368._4_4_ = auVar200._4_4_ + (float)local_428._4_4_;
  fStack_360 = auVar200._8_4_ + fStack_420;
  fStack_35c = auVar200._12_4_ + fStack_41c;
  auVar12 = vshufps_avx(auVar95,auVar95,0xff);
  auVar84._0_4_ = fVar243 * auVar12._0_4_;
  auVar84._4_4_ = fVar251 * auVar12._4_4_;
  auVar84._8_4_ = fVar252 * auVar12._8_4_;
  auVar84._12_4_ = fVar253 * auVar12._12_4_;
  local_378 = vsubps_avx(auVar95,auVar84);
  auVar8 = vshufps_avx(auVar69,auVar69,0xff);
  auVar71._0_4_ = fVar243 * auVar8._0_4_ + auVar12._0_4_ * fVar163 * auVar9._0_4_ * fVar159;
  auVar71._4_4_ = fVar251 * auVar8._4_4_ + auVar12._4_4_ * fVar163 * auVar9._4_4_ * fVar159;
  auVar71._8_4_ = fVar252 * auVar8._8_4_ + auVar12._8_4_ * fVar163 * auVar9._8_4_ * fVar159;
  auVar71._12_4_ = fVar253 * auVar8._12_4_ + auVar12._12_4_ * fVar163 * auVar9._12_4_ * fVar159;
  auVar12 = vsubps_avx(auVar69,auVar71);
  local_3e8 = auVar95._0_4_ + auVar84._0_4_;
  fStack_3e4 = auVar95._4_4_ + auVar84._4_4_;
  fStack_3e0 = auVar95._8_4_ + auVar84._8_4_;
  fStack_3dc = auVar95._12_4_ + auVar84._12_4_;
  local_388._0_4_ = local_358._0_4_ + auVar267._0_4_ * 0.33333334;
  local_388._4_4_ = local_358._4_4_ + auVar267._4_4_ * 0.33333334;
  local_388._8_4_ = local_358._8_4_ + auVar267._8_4_ * 0.33333334;
  local_388._12_4_ = local_358._12_4_ + auVar267._12_4_ * 0.33333334;
  auVar72._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar12._12_4_ * 0.33333334;
  local_398 = vsubps_avx(local_378,auVar72);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar267 = vsubps_avx(local_358,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar267,auVar267,0x55);
  auVar8 = vshufps_avx(auVar267,auVar267,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar140 = (pre->ray_space).vz.field_0.m128[0];
  fVar159 = (pre->ray_space).vz.field_0.m128[1];
  fVar161 = (pre->ray_space).vz.field_0.m128[2];
  fVar163 = (pre->ray_space).vz.field_0.m128[3];
  auVar73._0_4_ = fVar140 * auVar8._0_4_;
  auVar73._4_4_ = fVar159 * auVar8._4_4_;
  auVar73._8_4_ = fVar161 * auVar8._8_4_;
  auVar73._12_4_ = fVar163 * auVar8._12_4_;
  auVar95 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar12);
  auVar8 = vsubps_avx(local_388,(undefined1  [16])aVar1);
  local_468 = auVar8._0_4_;
  auVar12 = vshufps_avx(auVar8,auVar8,0x55);
  auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar74._0_4_ = fVar140 * auVar8._0_4_;
  auVar74._4_4_ = fVar159 * auVar8._4_4_;
  auVar74._8_4_ = fVar161 * auVar8._8_4_;
  auVar74._12_4_ = fVar163 * auVar8._12_4_;
  auVar83 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar12);
  auVar8 = vsubps_avx(local_398,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar75._0_4_ = fVar140 * auVar12._0_4_;
  auVar75._4_4_ = fVar159 * auVar12._4_4_;
  auVar75._8_4_ = fVar161 * auVar12._8_4_;
  auVar75._12_4_ = fVar163 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar8,auVar8,0x55);
  auVar67 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar2,auVar12);
  auVar9 = vsubps_avx(local_378,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar76._0_4_ = fVar140 * auVar12._0_4_;
  auVar76._4_4_ = fVar159 * auVar12._4_4_;
  auVar76._8_4_ = fVar161 * auVar12._8_4_;
  auVar76._12_4_ = fVar163 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar9,auVar9,0x55);
  auVar204 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar12);
  auVar10 = vsubps_avx(_local_368,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar148._0_4_ = fVar140 * auVar12._0_4_;
  auVar148._4_4_ = fVar159 * auVar12._4_4_;
  auVar148._8_4_ = fVar161 * auVar12._8_4_;
  auVar148._12_4_ = fVar163 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar109 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar2,auVar12);
  local_3a8._0_4_ = (fVar63 + auVar147._0_4_) * 0.33333334 + (float)local_368._0_4_;
  local_3a8._4_4_ = (fVar65 + auVar147._4_4_) * 0.33333334 + (float)local_368._4_4_;
  fStack_3a0 = (fVar141 + auVar147._8_4_) * 0.33333334 + fStack_360;
  fStack_39c = (fVar179 + auVar147._12_4_) * 0.33333334 + fStack_35c;
  auVar11 = vsubps_avx(_local_3a8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar235._0_4_ = fVar140 * auVar12._0_4_;
  auVar235._4_4_ = fVar159 * auVar12._4_4_;
  auVar235._8_4_ = fVar161 * auVar12._8_4_;
  auVar235._12_4_ = fVar163 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar125 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar2,auVar12);
  auVar224._0_4_ = (fVar108 + auVar71._0_4_) * 0.33333334;
  auVar224._4_4_ = (fVar121 + auVar71._4_4_) * 0.33333334;
  auVar224._8_4_ = (fVar122 + auVar71._8_4_) * 0.33333334;
  auVar224._12_4_ = (fVar123 + auVar71._12_4_) * 0.33333334;
  auVar47._4_4_ = fStack_3e4;
  auVar47._0_4_ = local_3e8;
  auVar47._8_4_ = fStack_3e0;
  auVar47._12_4_ = fStack_3dc;
  _local_3b8 = vsubps_avx(auVar47,auVar224);
  auVar69 = vsubps_avx(_local_3b8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar225._0_4_ = fVar140 * auVar12._0_4_;
  auVar225._4_4_ = fVar159 * auVar12._4_4_;
  auVar225._8_4_ = fVar161 * auVar12._8_4_;
  auVar225._12_4_ = fVar163 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar69,auVar69,0x55);
  auVar66 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar2,auVar12);
  auVar68 = vsubps_avx(auVar47,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar184._0_4_ = fVar140 * auVar12._0_4_;
  auVar184._4_4_ = fVar159 * auVar12._4_4_;
  auVar184._8_4_ = fVar161 * auVar12._8_4_;
  auVar184._12_4_ = fVar163 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar68,auVar68,0x55);
  auVar12 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar2,auVar12);
  local_428._0_4_ = auVar267._0_4_;
  auVar167._4_4_ = local_428._0_4_;
  auVar167._0_4_ = local_428._0_4_;
  auVar167._8_4_ = local_428._0_4_;
  auVar167._12_4_ = local_428._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar95 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar167);
  auVar168._4_4_ = local_468;
  auVar168._0_4_ = local_468;
  auVar168._8_4_ = local_468;
  auVar168._12_4_ = local_468;
  auVar83 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar168);
  uVar64 = auVar8._0_4_;
  auVar169._4_4_ = uVar64;
  auVar169._0_4_ = uVar64;
  auVar169._8_4_ = uVar64;
  auVar169._12_4_ = uVar64;
  auVar67 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar169);
  uVar64 = auVar9._0_4_;
  auVar170._4_4_ = uVar64;
  auVar170._0_4_ = uVar64;
  auVar170._8_4_ = uVar64;
  auVar170._12_4_ = uVar64;
  auVar9 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar170);
  uVar64 = auVar10._0_4_;
  auVar171._4_4_ = uVar64;
  auVar171._0_4_ = uVar64;
  auVar171._8_4_ = uVar64;
  auVar171._12_4_ = uVar64;
  auVar10 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar2,auVar171);
  uVar64 = auVar11._0_4_;
  auVar172._4_4_ = uVar64;
  auVar172._0_4_ = uVar64;
  auVar172._8_4_ = uVar64;
  auVar172._12_4_ = uVar64;
  auVar11 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar2,auVar172);
  uVar64 = auVar69._0_4_;
  auVar77._4_4_ = uVar64;
  auVar77._0_4_ = uVar64;
  auVar77._8_4_ = uVar64;
  auVar77._12_4_ = uVar64;
  auVar69 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar77);
  uVar64 = auVar68._0_4_;
  auVar78._4_4_ = uVar64;
  auVar78._0_4_ = uVar64;
  auVar78._8_4_ = uVar64;
  auVar78._12_4_ = uVar64;
  auVar68 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar78);
  local_478 = vmovlhps_avx(auVar95,auVar10);
  local_488 = vmovlhps_avx(auVar83,auVar11);
  local_498 = vmovlhps_avx(auVar67,auVar69);
  _local_258 = vmovlhps_avx(auVar9,auVar68);
  auVar271 = ZEXT1664(_local_258);
  auVar12 = vminps_avx(local_478,local_488);
  auVar8 = vminps_avx(local_498,_local_258);
  auVar267 = vminps_avx(auVar12,auVar8);
  auVar12 = vmaxps_avx(local_478,local_488);
  auVar8 = vmaxps_avx(local_498,_local_258);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vshufpd_avx(auVar267,auVar267,3);
  auVar267 = vminps_avx(auVar267,auVar8);
  auVar8 = vshufpd_avx(auVar12,auVar12,3);
  auVar8 = vmaxps_avx(auVar12,auVar8);
  auVar12 = vandps_avx(local_338,auVar267);
  auVar8 = vandps_avx(local_338,auVar8);
  auVar12 = vmaxps_avx(auVar12,auVar8);
  auVar8 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar8,auVar12);
  local_198 = auVar12._0_4_ * 9.536743e-07;
  auVar273._8_8_ = auVar95._0_8_;
  auVar273._0_8_ = auVar95._0_8_;
  auVar201._8_8_ = auVar83._0_8_;
  auVar201._0_8_ = auVar83._0_8_;
  auVar85._8_8_ = auVar67._0_8_;
  auVar85._0_8_ = auVar67._0_8_;
  auVar96._8_8_ = auVar9._0_8_;
  auVar96._0_8_ = auVar9._0_8_;
  _local_428 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = (uint)local_198 ^ local_348;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  uVar56 = 0;
  local_228 = vsubps_avx(local_488,local_478);
  local_238 = vsubps_avx(local_498,local_488);
  local_248 = vsubps_avx(_local_258,local_498);
  local_278 = vsubps_avx(_local_368,local_358);
  local_288 = vsubps_avx(_local_3a8,local_388);
  local_298 = vsubps_avx(_local_3b8,local_398);
  auVar48._4_4_ = fStack_3e4;
  auVar48._0_4_ = local_3e8;
  auVar48._8_4_ = fStack_3e0;
  auVar48._12_4_ = fStack_3dc;
  _local_2a8 = vsubps_avx(auVar48,local_378);
  local_4c8 = ZEXT816(0x3f80000000000000);
  local_268 = local_4c8;
  do {
    auVar12 = vshufps_avx(local_4c8,local_4c8,0x50);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = &DAT_3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._0_16_ = auVar111;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar8 = vsubps_avx(auVar111,auVar12);
    fVar140 = auVar12._0_4_;
    fVar122 = auVar10._0_4_;
    auVar79._0_4_ = fVar122 * fVar140;
    fVar159 = auVar12._4_4_;
    fVar123 = auVar10._4_4_;
    auVar79._4_4_ = fVar123 * fVar159;
    fVar161 = auVar12._8_4_;
    auVar79._8_4_ = fVar122 * fVar161;
    fVar163 = auVar12._12_4_;
    auVar79._12_4_ = fVar123 * fVar163;
    fVar254 = auVar11._0_4_;
    auVar149._0_4_ = fVar254 * fVar140;
    fVar264 = auVar11._4_4_;
    auVar149._4_4_ = fVar264 * fVar159;
    auVar149._8_4_ = fVar254 * fVar161;
    auVar149._12_4_ = fVar264 * fVar163;
    fVar221 = auVar69._0_4_;
    auVar185._0_4_ = fVar221 * fVar140;
    fVar232 = auVar69._4_4_;
    auVar185._4_4_ = fVar232 * fVar159;
    auVar185._8_4_ = fVar221 * fVar161;
    auVar185._12_4_ = fVar232 * fVar163;
    fVar108 = auVar68._0_4_;
    auVar226._0_4_ = fVar108 * fVar140;
    fVar121 = auVar68._4_4_;
    auVar226._4_4_ = fVar121 * fVar159;
    auVar226._8_4_ = fVar108 * fVar161;
    auVar226._12_4_ = fVar121 * fVar163;
    auVar95 = vfmadd231ps_fma(auVar79,auVar8,auVar273);
    auVar83 = vfmadd231ps_fma(auVar149,auVar8,auVar201);
    auVar67 = vfmadd231ps_fma(auVar185,auVar8,auVar85);
    auVar204 = vfmadd231ps_fma(auVar226,auVar96,auVar8);
    local_468 = auVar204._0_4_;
    auVar12 = vmovshdup_avx(local_268);
    fVar140 = local_268._0_4_;
    fVar63 = (auVar12._0_4_ - fVar140) * 0.04761905;
    auVar212._4_4_ = fVar140;
    auVar212._0_4_ = fVar140;
    auVar212._8_4_ = fVar140;
    auVar212._12_4_ = fVar140;
    auVar212._16_4_ = fVar140;
    auVar212._20_4_ = fVar140;
    auVar212._24_4_ = fVar140;
    auVar212._28_4_ = fVar140;
    auVar105._0_8_ = auVar12._0_8_;
    auVar105._8_8_ = auVar105._0_8_;
    auVar105._16_8_ = auVar105._0_8_;
    auVar105._24_8_ = auVar105._0_8_;
    auVar82 = vsubps_avx(auVar105,auVar212);
    uVar64 = auVar95._0_4_;
    auVar277._4_4_ = uVar64;
    auVar277._0_4_ = uVar64;
    auVar277._8_4_ = uVar64;
    auVar277._12_4_ = uVar64;
    auVar277._16_4_ = uVar64;
    auVar277._20_4_ = uVar64;
    auVar277._24_4_ = uVar64;
    auVar277._28_4_ = uVar64;
    auVar12 = vmovshdup_avx(auVar95);
    uVar164 = auVar12._0_8_;
    auVar262._8_8_ = uVar164;
    auVar262._0_8_ = uVar164;
    auVar262._16_8_ = uVar164;
    auVar262._24_8_ = uVar164;
    fVar65 = auVar83._0_4_;
    auVar93._4_4_ = fVar65;
    auVar93._0_4_ = fVar65;
    auVar93._8_4_ = fVar65;
    auVar93._12_4_ = fVar65;
    auVar93._16_4_ = fVar65;
    auVar93._20_4_ = fVar65;
    auVar93._24_4_ = fVar65;
    auVar93._28_4_ = fVar65;
    auVar8 = vmovshdup_avx(auVar83);
    auVar176._0_8_ = auVar8._0_8_;
    auVar176._8_8_ = auVar176._0_8_;
    auVar176._16_8_ = auVar176._0_8_;
    auVar176._24_8_ = auVar176._0_8_;
    fVar139 = auVar67._0_4_;
    auVar242._4_4_ = fVar139;
    auVar242._0_4_ = fVar139;
    auVar242._8_4_ = fVar139;
    auVar242._12_4_ = fVar139;
    auVar242._16_4_ = fVar139;
    auVar242._20_4_ = fVar139;
    auVar242._24_4_ = fVar139;
    auVar242._28_4_ = fVar139;
    auVar267 = vmovshdup_avx(auVar67);
    auVar220._0_8_ = auVar267._0_8_;
    auVar220._8_8_ = auVar220._0_8_;
    auVar220._16_8_ = auVar220._0_8_;
    auVar220._24_8_ = auVar220._0_8_;
    auVar9 = vmovshdup_avx(auVar204);
    auVar109 = vfmadd132ps_fma(auVar82,auVar212,_DAT_02020f20);
    auVar82 = vsubps_avx(auVar118,ZEXT1632(auVar109));
    fVar140 = auVar109._0_4_;
    auVar272._0_4_ = fVar65 * fVar140;
    fVar159 = auVar109._4_4_;
    auVar272._4_4_ = fVar65 * fVar159;
    fVar161 = auVar109._8_4_;
    auVar272._8_4_ = fVar65 * fVar161;
    fVar163 = auVar109._12_4_;
    auVar272._12_4_ = fVar65 * fVar163;
    auVar272._16_4_ = fVar65 * 0.0;
    auVar272._20_4_ = fVar65 * 0.0;
    auVar272._28_36_ = auVar271._28_36_;
    auVar272._24_4_ = fVar65 * 0.0;
    auVar109 = vfmadd231ps_fma(auVar272._0_32_,auVar82,auVar277);
    fVar141 = auVar8._0_4_;
    fVar179 = auVar8._4_4_;
    auVar13._4_4_ = fVar179 * fVar159;
    auVar13._0_4_ = fVar141 * fVar140;
    auVar13._8_4_ = fVar141 * fVar161;
    auVar13._12_4_ = fVar179 * fVar163;
    auVar13._16_4_ = fVar141 * 0.0;
    auVar13._20_4_ = fVar179 * 0.0;
    auVar13._24_4_ = fVar141 * 0.0;
    auVar13._28_4_ = local_468;
    auVar125 = vfmadd231ps_fma(auVar13,auVar82,auVar262);
    auVar14._4_4_ = fVar139 * fVar159;
    auVar14._0_4_ = fVar139 * fVar140;
    auVar14._8_4_ = fVar139 * fVar161;
    auVar14._12_4_ = fVar139 * fVar163;
    auVar14._16_4_ = fVar139 * 0.0;
    auVar14._20_4_ = fVar139 * 0.0;
    auVar14._24_4_ = fVar139 * 0.0;
    auVar14._28_4_ = auVar12._4_4_;
    auVar66 = vfmadd231ps_fma(auVar14,auVar82,auVar93);
    fVar141 = auVar267._0_4_;
    fVar179 = auVar267._4_4_;
    auVar15._4_4_ = fVar179 * fVar159;
    auVar15._0_4_ = fVar141 * fVar140;
    auVar15._8_4_ = fVar141 * fVar161;
    auVar15._12_4_ = fVar179 * fVar163;
    auVar15._16_4_ = fVar141 * 0.0;
    auVar15._20_4_ = fVar179 * 0.0;
    auVar15._24_4_ = fVar141 * 0.0;
    auVar15._28_4_ = uVar64;
    auVar130 = vfmadd231ps_fma(auVar15,auVar82,auVar176);
    auVar12 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar177._0_8_ = auVar12._0_8_;
    auVar177._8_8_ = auVar177._0_8_;
    auVar177._16_8_ = auVar177._0_8_;
    auVar177._24_8_ = auVar177._0_8_;
    auVar8 = vshufps_avx(auVar95,auVar95,0xff);
    uStack_400 = auVar8._0_8_;
    local_408 = (undefined1  [8])uStack_400;
    uStack_3f8 = uStack_400;
    uStack_3f0 = uStack_400;
    auVar16._4_4_ = fVar159 * local_468;
    auVar16._0_4_ = fVar140 * local_468;
    auVar16._8_4_ = fVar161 * local_468;
    auVar16._12_4_ = fVar163 * local_468;
    auVar16._16_4_ = local_468 * 0.0;
    auVar16._20_4_ = local_468 * 0.0;
    auVar16._24_4_ = local_468 * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar124 = vfmadd231ps_fma(auVar16,auVar82,auVar242);
    auVar267 = vshufps_avx(auVar83,auVar83,0xaa);
    auVar137._0_8_ = auVar267._0_8_;
    auVar137._8_8_ = auVar137._0_8_;
    auVar137._16_8_ = auVar137._0_8_;
    auVar137._24_8_ = auVar137._0_8_;
    auVar95 = vshufps_avx(auVar83,auVar83,0xff);
    auVar157._0_8_ = auVar95._0_8_;
    auVar157._8_8_ = auVar157._0_8_;
    auVar157._16_8_ = auVar157._0_8_;
    auVar157._24_8_ = auVar157._0_8_;
    fVar141 = auVar9._0_4_;
    fVar179 = auVar9._4_4_;
    auVar18._4_4_ = fVar179 * fVar159;
    auVar18._0_4_ = fVar141 * fVar140;
    auVar18._8_4_ = fVar141 * fVar161;
    auVar18._12_4_ = fVar179 * fVar163;
    auVar18._16_4_ = fVar141 * 0.0;
    auVar18._20_4_ = fVar179 * 0.0;
    auVar18._24_4_ = fVar141 * 0.0;
    auVar18._28_4_ = fVar139;
    auVar142 = vfmadd231ps_fma(auVar18,auVar82,auVar220);
    auVar250._28_4_ = fVar65;
    auVar250._0_28_ =
         ZEXT1628(CONCAT412(auVar66._12_4_ * fVar163,
                            CONCAT48(auVar66._8_4_ * fVar161,
                                     CONCAT44(auVar66._4_4_ * fVar159,auVar66._0_4_ * fVar140))));
    auVar109 = vfmadd231ps_fma(auVar250,auVar82,ZEXT1632(auVar109));
    auVar19._28_4_ = auVar8._4_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar130._12_4_ * fVar163,
                            CONCAT48(auVar130._8_4_ * fVar161,
                                     CONCAT44(auVar130._4_4_ * fVar159,auVar130._0_4_ * fVar140))));
    auVar125 = vfmadd231ps_fma(auVar19,auVar82,ZEXT1632(auVar125));
    auVar8 = vshufps_avx(auVar67,auVar67,0xaa);
    uVar164 = auVar8._0_8_;
    auVar249._8_8_ = uVar164;
    auVar249._0_8_ = uVar164;
    auVar249._16_8_ = uVar164;
    auVar249._24_8_ = uVar164;
    auVar9 = vshufps_avx(auVar67,auVar67,0xff);
    uVar164 = auVar9._0_8_;
    auVar269._8_8_ = uVar164;
    auVar269._0_8_ = uVar164;
    auVar269._16_8_ = uVar164;
    auVar269._24_8_ = uVar164;
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar124._12_4_,
                                                 CONCAT48(fVar161 * auVar124._8_4_,
                                                          CONCAT44(fVar159 * auVar124._4_4_,
                                                                   fVar140 * auVar124._0_4_)))),
                              auVar82,ZEXT1632(auVar66));
    auVar83 = vshufps_avx(auVar204,auVar204,0xaa);
    auVar67 = vshufps_avx(auVar204,auVar204,0xff);
    local_468 = auVar67._0_4_;
    fStack_464 = auVar67._4_4_;
    auVar20._28_4_ = fStack_464;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar142._12_4_ * fVar163,
                            CONCAT48(auVar142._8_4_ * fVar161,
                                     CONCAT44(auVar142._4_4_ * fVar159,auVar142._0_4_ * fVar140))));
    auVar67 = vfmadd231ps_fma(auVar20,auVar82,ZEXT1632(auVar130));
    auVar204 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar66._12_4_,
                                                  CONCAT48(fVar161 * auVar66._8_4_,
                                                           CONCAT44(fVar159 * auVar66._4_4_,
                                                                    fVar140 * auVar66._0_4_)))),
                               auVar82,ZEXT1632(auVar109));
    auVar13 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar109));
    auVar109 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar67._12_4_,
                                                  CONCAT48(fVar161 * auVar67._8_4_,
                                                           CONCAT44(fVar159 * auVar67._4_4_,
                                                                    fVar140 * auVar67._0_4_)))),
                               auVar82,ZEXT1632(auVar125));
    auVar14 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar125));
    fVar139 = fVar63 * auVar13._0_4_ * 3.0;
    fVar158 = fVar63 * auVar13._4_4_ * 3.0;
    auVar21._4_4_ = fVar158;
    auVar21._0_4_ = fVar139;
    fStack_460 = fVar63 * auVar13._8_4_ * 3.0;
    auVar21._8_4_ = fStack_460;
    fStack_45c = fVar63 * auVar13._12_4_ * 3.0;
    auVar21._12_4_ = fStack_45c;
    fStack_458 = fVar63 * auVar13._16_4_ * 3.0;
    auVar21._16_4_ = fStack_458;
    fStack_454 = fVar63 * auVar13._20_4_ * 3.0;
    auVar21._20_4_ = fStack_454;
    fStack_450 = fVar63 * auVar13._24_4_ * 3.0;
    auVar21._24_4_ = fStack_450;
    auVar21._28_4_ = 0x40400000;
    local_3d8._0_4_ = fVar63 * auVar14._0_4_ * 3.0;
    local_3d8._4_4_ = fVar63 * auVar14._4_4_ * 3.0;
    fStack_3d0 = fVar63 * auVar14._8_4_ * 3.0;
    fStack_3cc = fVar63 * auVar14._12_4_ * 3.0;
    fStack_3c8 = fVar63 * auVar14._16_4_ * 3.0;
    fStack_3c4 = fVar63 * auVar14._20_4_ * 3.0;
    fStack_3c0 = fVar63 * auVar14._24_4_ * 3.0;
    fStack_3bc = auVar14._28_4_;
    fVar65 = auVar267._0_4_;
    fVar141 = auVar267._4_4_;
    auVar22._4_4_ = fVar141 * fVar159;
    auVar22._0_4_ = fVar65 * fVar140;
    auVar22._8_4_ = fVar65 * fVar161;
    auVar22._12_4_ = fVar141 * fVar163;
    auVar22._16_4_ = fVar65 * 0.0;
    auVar22._20_4_ = fVar141 * 0.0;
    auVar22._24_4_ = fVar65 * 0.0;
    auVar22._28_4_ = auVar13._28_4_;
    auVar267 = vfmadd231ps_fma(auVar22,auVar82,auVar177);
    fVar65 = auVar95._0_4_;
    fVar179 = auVar95._4_4_;
    auVar23._4_4_ = fVar179 * fVar159;
    auVar23._0_4_ = fVar65 * fVar140;
    auVar23._8_4_ = fVar65 * fVar161;
    auVar23._12_4_ = fVar179 * fVar163;
    auVar23._16_4_ = fVar65 * 0.0;
    auVar23._20_4_ = fVar179 * 0.0;
    auVar23._24_4_ = fVar65 * 0.0;
    auVar23._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar23,auVar82,_local_408);
    fVar65 = auVar8._0_4_;
    fVar179 = auVar8._4_4_;
    auVar24._4_4_ = fVar179 * fVar159;
    auVar24._0_4_ = fVar65 * fVar140;
    auVar24._8_4_ = fVar65 * fVar161;
    auVar24._12_4_ = fVar179 * fVar163;
    auVar24._16_4_ = fVar65 * 0.0;
    auVar24._20_4_ = fVar179 * 0.0;
    auVar24._24_4_ = fVar65 * 0.0;
    auVar24._28_4_ = fVar63;
    auVar8 = vfmadd231ps_fma(auVar24,auVar82,auVar137);
    fVar65 = auVar9._0_4_;
    fVar160 = auVar9._4_4_;
    auVar25._4_4_ = fVar160 * fVar159;
    auVar25._0_4_ = fVar65 * fVar140;
    auVar25._8_4_ = fVar65 * fVar161;
    auVar25._12_4_ = fVar160 * fVar163;
    auVar25._16_4_ = fVar65 * 0.0;
    auVar25._20_4_ = fVar160 * 0.0;
    auVar25._24_4_ = fVar65 * 0.0;
    auVar25._28_4_ = fVar141;
    auVar9 = vfmadd231ps_fma(auVar25,auVar82,auVar157);
    local_218 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar204));
    fVar65 = auVar83._0_4_;
    fVar141 = auVar83._4_4_;
    auVar26._4_4_ = fVar141 * fVar159;
    auVar26._0_4_ = fVar65 * fVar140;
    auVar26._8_4_ = fVar65 * fVar161;
    auVar26._12_4_ = fVar141 * fVar163;
    auVar26._16_4_ = fVar65 * 0.0;
    auVar26._20_4_ = fVar141 * 0.0;
    auVar26._24_4_ = fVar65 * 0.0;
    auVar26._28_4_ = local_218._28_4_;
    auVar95 = vfmadd231ps_fma(auVar26,auVar82,auVar249);
    _local_408 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar109));
    auVar18 = _local_408;
    auVar27._4_4_ = fVar159 * fStack_464;
    auVar27._0_4_ = fVar140 * local_468;
    auVar27._8_4_ = fVar161 * local_468;
    auVar27._12_4_ = fVar163 * fStack_464;
    auVar27._16_4_ = local_468 * 0.0;
    auVar27._20_4_ = fStack_464 * 0.0;
    auVar27._24_4_ = local_468 * 0.0;
    auVar27._28_4_ = fVar179;
    auVar83 = vfmadd231ps_fma(auVar27,auVar82,auVar269);
    auVar28._28_4_ = fVar141;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar163 * auVar8._12_4_,
                            CONCAT48(fVar161 * auVar8._8_4_,
                                     CONCAT44(fVar159 * auVar8._4_4_,fVar140 * auVar8._0_4_))));
    auVar267 = vfmadd231ps_fma(auVar28,auVar82,ZEXT1632(auVar267));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar9._12_4_,
                                                 CONCAT48(fVar161 * auVar9._8_4_,
                                                          CONCAT44(fVar159 * auVar9._4_4_,
                                                                   fVar140 * auVar9._0_4_)))),
                              auVar82,ZEXT1632(auVar12));
    local_468 = auVar204._0_4_ + fVar139;
    fStack_464 = auVar204._4_4_ + fVar158;
    fStack_460 = auVar204._8_4_ + fStack_460;
    fStack_45c = auVar204._12_4_ + fStack_45c;
    fStack_458 = fStack_458 + 0.0;
    fStack_454 = fStack_454 + 0.0;
    fStack_450 = fStack_450 + 0.0;
    uStack_44c = 0x40400000;
    auVar29._28_4_ = 0x40400000;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar83._12_4_ * fVar163,
                            CONCAT48(auVar83._8_4_ * fVar161,
                                     CONCAT44(auVar83._4_4_ * fVar159,auVar83._0_4_ * fVar140))));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar95._12_4_,
                                                CONCAT48(fVar161 * auVar95._8_4_,
                                                         CONCAT44(fVar159 * auVar95._4_4_,
                                                                  fVar140 * auVar95._0_4_)))),
                             auVar82,ZEXT1632(auVar8));
    auVar9 = vfmadd231ps_fma(auVar29,auVar82,ZEXT1632(auVar9));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar8._12_4_,
                                                 CONCAT48(fVar161 * auVar8._8_4_,
                                                          CONCAT44(fVar159 * auVar8._4_4_,
                                                                   fVar140 * auVar8._0_4_)))),
                              auVar82,ZEXT1632(auVar267));
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar163 * auVar9._12_4_,
                                                 CONCAT48(fVar161 * auVar9._8_4_,
                                                          CONCAT44(fVar159 * auVar9._4_4_,
                                                                   fVar140 * auVar9._0_4_)))),
                              ZEXT1632(auVar12),auVar82);
    auVar82 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar267));
    auVar13 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar12));
    fVar140 = fVar63 * auVar82._0_4_ * 3.0;
    fVar159 = fVar63 * auVar82._4_4_ * 3.0;
    auVar30._4_4_ = fVar159;
    auVar30._0_4_ = fVar140;
    fVar161 = fVar63 * auVar82._8_4_ * 3.0;
    auVar30._8_4_ = fVar161;
    fVar163 = fVar63 * auVar82._12_4_ * 3.0;
    auVar30._12_4_ = fVar163;
    fVar139 = fVar63 * auVar82._16_4_ * 3.0;
    auVar30._16_4_ = fVar139;
    fVar158 = fVar63 * auVar82._20_4_ * 3.0;
    auVar30._20_4_ = fVar158;
    fVar160 = fVar63 * auVar82._24_4_ * 3.0;
    auVar30._24_4_ = fVar160;
    auVar30._28_4_ = 0x40400000;
    auVar196._0_4_ = fVar63 * auVar13._0_4_ * 3.0;
    auVar196._4_4_ = fVar63 * auVar13._4_4_ * 3.0;
    auVar196._8_4_ = fVar63 * auVar13._8_4_ * 3.0;
    auVar196._12_4_ = fVar63 * auVar13._12_4_ * 3.0;
    auVar196._16_4_ = fVar63 * auVar13._16_4_ * 3.0;
    auVar196._20_4_ = fVar63 * auVar13._20_4_ * 3.0;
    auVar196._24_4_ = fVar63 * auVar13._24_4_ * 3.0;
    auVar196._28_4_ = 0;
    local_448 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar95));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar83));
    auVar82 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar204));
    auVar13 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar109));
    auVar15 = vsubps_avx(local_448,local_218);
    fVar162 = auVar82._0_4_ + auVar15._0_4_;
    fVar243 = auVar82._4_4_ + auVar15._4_4_;
    fVar251 = auVar82._8_4_ + auVar15._8_4_;
    fVar252 = auVar82._12_4_ + auVar15._12_4_;
    fVar253 = auVar82._16_4_ + auVar15._16_4_;
    fVar180 = auVar82._20_4_ + auVar15._20_4_;
    fVar181 = auVar82._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_78,_local_408);
    auVar263._0_4_ = auVar13._0_4_ + auVar16._0_4_;
    auVar263._4_4_ = auVar13._4_4_ + auVar16._4_4_;
    auVar263._8_4_ = auVar13._8_4_ + auVar16._8_4_;
    auVar263._12_4_ = auVar13._12_4_ + auVar16._12_4_;
    auVar263._16_4_ = auVar13._16_4_ + auVar16._16_4_;
    auVar263._20_4_ = auVar13._20_4_ + auVar16._20_4_;
    auVar263._24_4_ = auVar13._24_4_ + auVar16._24_4_;
    auVar263._28_4_ = auVar13._28_4_ + auVar16._28_4_;
    fVar63 = auVar109._0_4_;
    local_158 = fVar63 + (float)local_3d8._0_4_;
    fVar65 = auVar109._4_4_;
    fStack_154 = fVar65 + (float)local_3d8._4_4_;
    fVar141 = auVar109._8_4_;
    fStack_150 = fVar141 + fStack_3d0;
    fVar179 = auVar109._12_4_;
    fStack_14c = fVar179 + fStack_3cc;
    fStack_148 = fStack_3c8 + 0.0;
    fStack_144 = fStack_3c4 + 0.0;
    fStack_140 = fStack_3c0 + 0.0;
    fStack_13c = auVar14._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar204);
    auVar13 = vsubps_avx(local_98,auVar21);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_b8 = ZEXT1632(auVar109);
    auVar13 = vsubps_avx(local_b8,_local_3d8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_f8._0_4_ = auVar95._0_4_ + fVar140;
    local_f8._4_4_ = auVar95._4_4_ + fVar159;
    local_f8._8_4_ = auVar95._8_4_ + fVar161;
    local_f8._12_4_ = auVar95._12_4_ + fVar163;
    local_f8._16_4_ = fVar139 + 0.0;
    local_f8._20_4_ = fVar158 + 0.0;
    local_f8._24_4_ = fVar160 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar250 = ZEXT1632(auVar95);
    auVar13 = vsubps_avx(auVar250,auVar30);
    _local_3d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar140 = auVar83._0_4_;
    local_138._0_4_ = fVar140 + auVar196._0_4_;
    fVar159 = auVar83._4_4_;
    local_138._4_4_ = fVar159 + auVar196._4_4_;
    fVar161 = auVar83._8_4_;
    local_138._8_4_ = fVar161 + auVar196._8_4_;
    fVar163 = auVar83._12_4_;
    local_138._12_4_ = fVar163 + auVar196._12_4_;
    local_138._16_4_ = auVar196._16_4_ + 0.0;
    local_138._20_4_ = auVar196._20_4_ + 0.0;
    local_138._24_4_ = auVar196._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar83),auVar196);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar31._4_4_ = fVar65 * fVar243;
    auVar31._0_4_ = fVar63 * fVar162;
    auVar31._8_4_ = fVar141 * fVar251;
    auVar31._12_4_ = fVar179 * fVar252;
    auVar31._16_4_ = fVar253 * 0.0;
    auVar31._20_4_ = fVar180 * 0.0;
    auVar31._24_4_ = fVar181 * 0.0;
    auVar31._28_4_ = auVar13._28_4_;
    auVar12 = vfnmadd231ps_fma(auVar31,local_98,auVar263);
    auVar32._4_4_ = fStack_154 * fVar243;
    auVar32._0_4_ = local_158 * fVar162;
    auVar32._8_4_ = fStack_150 * fVar251;
    auVar32._12_4_ = fStack_14c * fVar252;
    auVar32._16_4_ = fStack_148 * fVar253;
    auVar32._20_4_ = fStack_144 * fVar180;
    auVar32._24_4_ = fStack_140 * fVar181;
    auVar32._28_4_ = local_3d8._28_4_;
    auVar45._4_4_ = fStack_464;
    auVar45._0_4_ = local_468;
    auVar45._8_4_ = fStack_460;
    auVar45._12_4_ = fStack_45c;
    auVar45._16_4_ = fStack_458;
    auVar45._20_4_ = fStack_454;
    auVar45._24_4_ = fStack_450;
    auVar45._28_4_ = 0x40400000;
    auVar8 = vfnmadd231ps_fma(auVar32,auVar263,auVar45);
    auVar33._4_4_ = local_178._4_4_ * fVar243;
    auVar33._0_4_ = local_178._0_4_ * fVar162;
    auVar33._8_4_ = local_178._8_4_ * fVar251;
    auVar33._12_4_ = local_178._12_4_ * fVar252;
    auVar33._16_4_ = local_178._16_4_ * fVar253;
    auVar33._20_4_ = local_178._20_4_ * fVar180;
    auVar33._24_4_ = local_178._24_4_ * fVar181;
    auVar33._28_4_ = fStack_13c;
    auVar267 = vfnmadd231ps_fma(auVar33,local_d8,auVar263);
    auVar34._4_4_ = fVar243 * (float)local_408._4_4_;
    auVar34._0_4_ = fVar162 * (float)local_408._0_4_;
    auVar34._8_4_ = fVar251 * (float)uStack_400;
    auVar34._12_4_ = fVar252 * uStack_400._4_4_;
    auVar34._16_4_ = fVar253 * (float)uStack_3f8;
    auVar34._20_4_ = fVar180 * uStack_3f8._4_4_;
    auVar34._24_4_ = fVar181 * (float)uStack_3f0;
    auVar34._28_4_ = local_178._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar34,local_218,auVar263);
    auVar52._4_4_ = fVar159 * fVar243;
    auVar52._0_4_ = fVar140 * fVar162;
    auVar52._8_4_ = fVar161 * fVar251;
    auVar52._12_4_ = fVar163 * fVar252;
    auVar52._16_4_ = fVar253 * 0.0;
    auVar52._20_4_ = fVar180 * 0.0;
    auVar52._24_4_ = fVar181 * 0.0;
    auVar52._28_4_ = DAT_0205d4a0._28_4_;
    auVar95 = vfnmadd231ps_fma(auVar52,auVar250,auVar263);
    auVar35._4_4_ = local_138._4_4_ * fVar243;
    auVar35._0_4_ = local_138._0_4_ * fVar162;
    auVar35._8_4_ = local_138._8_4_ * fVar251;
    auVar35._12_4_ = local_138._12_4_ * fVar252;
    auVar35._16_4_ = local_138._16_4_ * fVar253;
    auVar35._20_4_ = local_138._20_4_ * fVar180;
    auVar35._24_4_ = local_138._24_4_ * fVar181;
    auVar35._28_4_ = local_218._28_4_;
    auVar67 = vfnmadd231ps_fma(auVar35,local_f8,auVar263);
    auVar36._4_4_ = local_118._4_4_ * fVar243;
    auVar36._0_4_ = local_118._0_4_ * fVar162;
    auVar36._8_4_ = local_118._8_4_ * fVar251;
    auVar36._12_4_ = local_118._12_4_ * fVar252;
    auVar36._16_4_ = local_118._16_4_ * fVar253;
    auVar36._20_4_ = local_118._20_4_ * fVar180;
    auVar36._24_4_ = local_118._24_4_ * fVar181;
    auVar36._28_4_ = local_d8._28_4_;
    auVar204 = vfnmadd231ps_fma(auVar36,auVar263,_local_3d8);
    auVar37._4_4_ = local_78._4_4_ * fVar243;
    auVar37._0_4_ = local_78._0_4_ * fVar162;
    auVar37._8_4_ = local_78._8_4_ * fVar251;
    auVar37._12_4_ = local_78._12_4_ * fVar252;
    auVar37._16_4_ = local_78._16_4_ * fVar253;
    auVar37._20_4_ = local_78._20_4_ * fVar180;
    auVar37._24_4_ = local_78._24_4_ * fVar181;
    auVar37._28_4_ = auVar82._28_4_ + auVar15._28_4_;
    auVar109 = vfnmadd231ps_fma(auVar37,auVar263,local_448);
    auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar82 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar267),ZEXT1632(auVar9));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar267),ZEXT1632(auVar9));
    auVar82 = vmaxps_avx(auVar82,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar67));
    auVar13 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar67));
    auVar16 = vminps_avx(ZEXT1632(auVar204),ZEXT1632(auVar109));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar204),ZEXT1632(auVar109));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar82,auVar13);
    auVar51._4_4_ = fStack_194;
    auVar51._0_4_ = local_198;
    auVar51._8_4_ = fStack_190;
    auVar51._12_4_ = fStack_18c;
    auVar51._16_4_ = fStack_188;
    auVar51._20_4_ = fStack_184;
    auVar51._24_4_ = fStack_180;
    auVar51._28_4_ = fStack_17c;
    auVar82 = vcmpps_avx(auVar15,auVar51,2);
    auVar50._4_4_ = uStack_1b4;
    auVar50._0_4_ = local_1b8;
    auVar50._8_4_ = uStack_1b0;
    auVar50._12_4_ = uStack_1ac;
    auVar50._16_4_ = uStack_1a8;
    auVar50._20_4_ = uStack_1a4;
    auVar50._24_4_ = uStack_1a0;
    auVar50._28_4_ = uStack_19c;
    auVar13 = vcmpps_avx(auVar13,auVar50,5);
    auVar82 = vandps_avx(auVar13,auVar82);
    auVar13 = local_1f8 & auVar82;
    uVar54 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_218,local_98);
      auVar14 = vsubps_avx(local_448,auVar250);
      fVar158 = auVar13._0_4_ + auVar14._0_4_;
      fVar160 = auVar13._4_4_ + auVar14._4_4_;
      fVar162 = auVar13._8_4_ + auVar14._8_4_;
      fVar243 = auVar13._12_4_ + auVar14._12_4_;
      fVar251 = auVar13._16_4_ + auVar14._16_4_;
      fVar252 = auVar13._20_4_ + auVar14._20_4_;
      fVar253 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(_local_408,local_b8);
      auVar16 = vsubps_avx(local_78,ZEXT1632(auVar83));
      auVar94._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar94._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar94._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar94._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar94._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar94._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar94._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar139 = auVar16._28_4_;
      auVar94._28_4_ = auVar15._28_4_ + fVar139;
      auVar270._0_4_ = fVar63 * fVar158;
      auVar270._4_4_ = fVar65 * fVar160;
      auVar270._8_4_ = fVar141 * fVar162;
      auVar270._12_4_ = fVar179 * fVar243;
      auVar270._16_4_ = fVar251 * 0.0;
      auVar270._20_4_ = fVar252 * 0.0;
      auVar270._24_4_ = fVar253 * 0.0;
      auVar270._28_4_ = 0;
      auVar95 = vfnmadd231ps_fma(auVar270,auVar94,local_98);
      auVar38._4_4_ = fVar160 * fStack_154;
      auVar38._0_4_ = fVar158 * local_158;
      auVar38._8_4_ = fVar162 * fStack_150;
      auVar38._12_4_ = fVar243 * fStack_14c;
      auVar38._16_4_ = fVar251 * fStack_148;
      auVar38._20_4_ = fVar252 * fStack_144;
      auVar38._24_4_ = fVar253 * fStack_140;
      auVar38._28_4_ = fVar139;
      auVar46._4_4_ = fStack_464;
      auVar46._0_4_ = local_468;
      auVar46._8_4_ = fStack_460;
      auVar46._12_4_ = fStack_45c;
      auVar46._16_4_ = fStack_458;
      auVar46._20_4_ = fStack_454;
      auVar46._24_4_ = fStack_450;
      auVar46._28_4_ = 0x40400000;
      auVar12 = vfnmadd213ps_fma(auVar46,auVar94,auVar38);
      auVar39._4_4_ = fVar160 * local_178._4_4_;
      auVar39._0_4_ = fVar158 * local_178._0_4_;
      auVar39._8_4_ = fVar162 * local_178._8_4_;
      auVar39._12_4_ = fVar243 * local_178._12_4_;
      auVar39._16_4_ = fVar251 * local_178._16_4_;
      auVar39._20_4_ = fVar252 * local_178._20_4_;
      auVar39._24_4_ = fVar253 * local_178._24_4_;
      auVar39._28_4_ = fVar139;
      auVar8 = vfnmadd213ps_fma(local_d8,auVar94,auVar39);
      auVar40._4_4_ = (float)local_408._4_4_ * fVar160;
      auVar40._0_4_ = (float)local_408._0_4_ * fVar158;
      auVar40._8_4_ = (float)uStack_400 * fVar162;
      auVar40._12_4_ = uStack_400._4_4_ * fVar243;
      auVar40._16_4_ = (float)uStack_3f8 * fVar251;
      auVar40._20_4_ = uStack_3f8._4_4_ * fVar252;
      auVar40._24_4_ = (float)uStack_3f0 * fVar253;
      auVar40._28_4_ = fVar139;
      auVar83 = vfnmadd231ps_fma(auVar40,auVar94,local_218);
      auVar106._0_4_ = fVar140 * fVar158;
      auVar106._4_4_ = fVar159 * fVar160;
      auVar106._8_4_ = fVar161 * fVar162;
      auVar106._12_4_ = fVar163 * fVar243;
      auVar106._16_4_ = fVar251 * 0.0;
      auVar106._20_4_ = fVar252 * 0.0;
      auVar106._24_4_ = fVar253 * 0.0;
      auVar106._28_4_ = 0;
      auVar67 = vfnmadd231ps_fma(auVar106,auVar94,auVar250);
      auVar41._4_4_ = fVar160 * local_138._4_4_;
      auVar41._0_4_ = fVar158 * local_138._0_4_;
      auVar41._8_4_ = fVar162 * local_138._8_4_;
      auVar41._12_4_ = fVar243 * local_138._12_4_;
      auVar41._16_4_ = fVar251 * local_138._16_4_;
      auVar41._20_4_ = fVar252 * local_138._20_4_;
      auVar41._24_4_ = fVar253 * local_138._24_4_;
      auVar41._28_4_ = local_408._28_4_;
      auVar267 = vfnmadd213ps_fma(local_f8,auVar94,auVar41);
      auVar42._4_4_ = fVar160 * local_118._4_4_;
      auVar42._0_4_ = fVar158 * local_118._0_4_;
      auVar42._8_4_ = fVar162 * local_118._8_4_;
      auVar42._12_4_ = fVar243 * local_118._12_4_;
      auVar42._16_4_ = fVar251 * local_118._16_4_;
      auVar42._20_4_ = fVar252 * local_118._20_4_;
      auVar42._24_4_ = fVar253 * local_118._24_4_;
      auVar42._28_4_ = local_408._28_4_;
      auVar9 = vfnmadd213ps_fma(_local_3d8,auVar94,auVar42);
      auVar43._4_4_ = local_78._4_4_ * fVar160;
      auVar43._0_4_ = local_78._0_4_ * fVar158;
      auVar43._8_4_ = local_78._8_4_ * fVar162;
      auVar43._12_4_ = local_78._12_4_ * fVar243;
      auVar43._16_4_ = local_78._16_4_ * fVar251;
      auVar43._20_4_ = local_78._20_4_ * fVar252;
      auVar43._24_4_ = local_78._24_4_ * fVar253;
      auVar43._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar204 = vfnmadd231ps_fma(auVar43,auVar94,local_448);
      auVar14 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar12));
      auVar13 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar12));
      auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar267));
      auVar14 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar267));
      auVar250 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar204));
      auVar16 = vminps_avx(auVar16,auVar250);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar204));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,auVar51,2);
      auVar14 = vcmpps_avx(auVar14,auVar50,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar82 = vandps_avx(auVar82,local_1f8);
      auVar14 = auVar82 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar13,auVar82);
        uVar54 = vmovmskps_avx(auVar82);
      }
    }
    _local_408 = auVar18;
    if (uVar54 != 0) {
      auStack_2f8[uVar56] = uVar54;
      uVar164 = vmovlps_avx(local_268);
      *(undefined8 *)(&uStack_1d8 + uVar56 * 2) = uVar164;
      uVar62 = vmovlps_avx(local_4c8);
      auStack_58[uVar56] = uVar62;
      uVar56 = (ulong)((int)uVar56 + 1);
    }
    do {
      if ((int)uVar56 == 0) {
        fVar140 = (ray->super_RayK<1>).tfar;
        auVar81._4_4_ = fVar140;
        auVar81._0_4_ = fVar140;
        auVar81._8_4_ = fVar140;
        auVar81._12_4_ = fVar140;
        auVar12 = vcmpps_avx(local_2b8,auVar81,2);
        uVar53 = vmovmskps_avx(auVar12);
        uVar53 = (uint)uVar59 & uVar53;
        if (uVar53 == 0) {
          return;
        }
        goto LAB_01650d6e;
      }
      uVar55 = (int)uVar56 - 1;
      uVar57 = (ulong)uVar55;
      uVar61 = auStack_2f8[uVar57];
      uVar54 = (&uStack_1d8)[uVar57 * 2];
      fVar140 = afStack_1d4[uVar57 * 2];
      iVar17 = 0;
      for (uVar62 = (ulong)uVar61; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        iVar17 = iVar17 + 1;
      }
      uVar61 = uVar61 - 1 & uVar61;
      if (uVar61 == 0) {
        uVar56 = (ulong)uVar55;
      }
      local_4c8._8_8_ = 0;
      local_4c8._0_8_ = auStack_58[uVar57];
      auStack_2f8[uVar57] = uVar61;
      fVar159 = (float)(iVar17 + 1) * 0.14285715;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * (float)iVar17 * 0.14285715)),
                                ZEXT416(uVar54),ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * fVar159)),ZEXT416(uVar54),
                               ZEXT416((uint)(1.0 - fVar159)));
      auVar271 = ZEXT1664(auVar8);
      fVar159 = auVar12._0_4_;
      local_468 = auVar8._0_4_;
      fVar140 = local_468 - fVar159;
      local_448._0_16_ = auVar12;
      fStack_464 = auVar8._4_4_;
      fStack_460 = auVar8._8_4_;
      fStack_45c = auVar8._12_4_;
      if (0.16666667 <= fVar140) break;
      auVar267 = vshufps_avx(local_4c8,local_4c8,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = &DAT_3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar9 = vsubps_avx(auVar97,auVar267);
      fVar161 = auVar267._0_4_;
      auVar112._0_4_ = fVar122 * fVar161;
      fVar163 = auVar267._4_4_;
      auVar112._4_4_ = fVar123 * fVar163;
      fVar63 = auVar267._8_4_;
      auVar112._8_4_ = fVar122 * fVar63;
      fVar65 = auVar267._12_4_;
      auVar112._12_4_ = fVar123 * fVar65;
      auVar128._0_4_ = fVar254 * fVar161;
      auVar128._4_4_ = fVar264 * fVar163;
      auVar128._8_4_ = fVar254 * fVar63;
      auVar128._12_4_ = fVar264 * fVar65;
      auVar150._0_4_ = fVar221 * fVar161;
      auVar150._4_4_ = fVar232 * fVar163;
      auVar150._8_4_ = fVar221 * fVar63;
      auVar150._12_4_ = fVar232 * fVar65;
      auVar86._0_4_ = fVar108 * fVar161;
      auVar86._4_4_ = fVar121 * fVar163;
      auVar86._8_4_ = fVar108 * fVar63;
      auVar86._12_4_ = fVar121 * fVar65;
      auVar267 = vfmadd231ps_fma(auVar112,auVar9,auVar273);
      auVar95 = vfmadd231ps_fma(auVar128,auVar9,auVar201);
      auVar83 = vfmadd231ps_fma(auVar150,auVar9,auVar85);
      auVar9 = vfmadd231ps_fma(auVar86,auVar96,auVar9);
      auVar107._16_16_ = auVar267;
      auVar107._0_16_ = auVar267;
      auVar119._16_16_ = auVar95;
      auVar119._0_16_ = auVar95;
      auVar138._16_16_ = auVar83;
      auVar138._0_16_ = auVar83;
      auVar178._4_4_ = fVar159;
      auVar178._0_4_ = fVar159;
      auVar178._8_4_ = fVar159;
      auVar178._12_4_ = fVar159;
      auVar178._20_4_ = local_468;
      auVar178._16_4_ = local_468;
      auVar178._24_4_ = local_468;
      auVar178._28_4_ = local_468;
      auVar82 = vsubps_avx(auVar119,auVar107);
      auVar95 = vfmadd213ps_fma(auVar82,auVar178,auVar107);
      auVar82 = vsubps_avx(auVar138,auVar119);
      auVar67 = vfmadd213ps_fma(auVar82,auVar178,auVar119);
      auVar267 = vsubps_avx(auVar9,auVar83);
      auVar120._16_16_ = auVar267;
      auVar120._0_16_ = auVar267;
      auVar267 = vfmadd213ps_fma(auVar120,auVar178,auVar138);
      auVar82 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar95));
      auVar9 = vfmadd213ps_fma(auVar82,auVar178,ZEXT1632(auVar95));
      auVar82 = vsubps_avx(ZEXT1632(auVar267),ZEXT1632(auVar67));
      auVar267 = vfmadd213ps_fma(auVar82,auVar178,ZEXT1632(auVar67));
      auVar82 = vsubps_avx(ZEXT1632(auVar267),ZEXT1632(auVar9));
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar82,auVar178);
      fVar179 = auVar82._4_4_ * 3.0;
      fVar141 = fVar140 * 0.33333334;
      local_218._0_8_ =
           CONCAT44(auVar125._4_4_ + fVar141 * fVar179,
                    auVar125._0_4_ + fVar141 * auVar82._0_4_ * 3.0);
      local_218._8_4_ = auVar125._8_4_ + fVar141 * auVar82._8_4_ * 3.0;
      local_218._12_4_ = auVar125._12_4_ + fVar141 * auVar82._12_4_ * 3.0;
      auVar9 = vshufpd_avx(auVar125,auVar125,3);
      auVar95 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_3d8 = auVar9;
      auVar267 = vsubps_avx(auVar9,auVar125);
      _local_408 = auVar95;
      auVar83 = vsubps_avx(auVar95,(undefined1  [16])0x0);
      auVar98._0_4_ = auVar267._0_4_ + auVar83._0_4_;
      auVar98._4_4_ = auVar267._4_4_ + auVar83._4_4_;
      auVar98._8_4_ = auVar267._8_4_ + auVar83._8_4_;
      auVar98._12_4_ = auVar267._12_4_ + auVar83._12_4_;
      auVar267 = vshufps_avx(auVar125,auVar125,0xb1);
      auVar83 = vshufps_avx(local_218._0_16_,local_218._0_16_,0xb1);
      auVar256._4_4_ = auVar98._0_4_;
      auVar256._0_4_ = auVar98._0_4_;
      auVar256._8_4_ = auVar98._0_4_;
      auVar256._12_4_ = auVar98._0_4_;
      auVar67 = vshufps_avx(auVar98,auVar98,0x55);
      fVar161 = auVar67._0_4_;
      auVar186._0_4_ = auVar267._0_4_ * fVar161;
      fVar163 = auVar67._4_4_;
      auVar186._4_4_ = auVar267._4_4_ * fVar163;
      fVar63 = auVar67._8_4_;
      auVar186._8_4_ = auVar267._8_4_ * fVar63;
      fVar65 = auVar67._12_4_;
      auVar186._12_4_ = auVar267._12_4_ * fVar65;
      auVar202._0_4_ = auVar83._0_4_ * fVar161;
      auVar202._4_4_ = auVar83._4_4_ * fVar163;
      auVar202._8_4_ = auVar83._8_4_ * fVar63;
      auVar202._12_4_ = auVar83._12_4_ * fVar65;
      auVar204 = vfmadd231ps_fma(auVar186,auVar256,auVar125);
      auVar109 = vfmadd231ps_fma(auVar202,auVar256,local_218._0_16_);
      auVar83 = vshufps_avx(auVar204,auVar204,0xe8);
      auVar67 = vshufps_avx(auVar109,auVar109,0xe8);
      auVar267 = vcmpps_avx(auVar83,auVar67,1);
      uVar54 = vextractps_avx(auVar267,0);
      auVar66 = auVar109;
      if ((uVar54 & 1) == 0) {
        auVar66 = auVar204;
      }
      auVar129._0_4_ = fVar141 * auVar82._16_4_ * 3.0;
      auVar129._4_4_ = fVar141 * fVar179;
      auVar129._8_4_ = fVar141 * auVar82._24_4_ * 3.0;
      auVar129._12_4_ = fVar141 * local_468;
      auVar143 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar130 = vshufps_avx(auVar143,auVar143,0xb1);
      auVar124 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar274._0_4_ = auVar130._0_4_ * fVar161;
      auVar274._4_4_ = auVar130._4_4_ * fVar163;
      auVar274._8_4_ = auVar130._8_4_ * fVar63;
      auVar274._12_4_ = auVar130._12_4_ * fVar65;
      auVar99._0_4_ = auVar124._0_4_ * fVar161;
      auVar99._4_4_ = auVar124._4_4_ * fVar163;
      auVar99._8_4_ = auVar124._8_4_ * fVar63;
      auVar99._12_4_ = auVar124._12_4_ * fVar65;
      auVar144 = vfmadd231ps_fma(auVar274,auVar256,auVar143);
      auVar182 = vfmadd231ps_fma(auVar99,(undefined1  [16])0x0,auVar256);
      auVar124 = vshufps_avx(auVar144,auVar144,0xe8);
      auVar142 = vshufps_avx(auVar182,auVar182,0xe8);
      auVar130 = vcmpps_avx(auVar124,auVar142,1);
      uVar54 = vextractps_avx(auVar130,0);
      auVar197 = auVar182;
      if ((uVar54 & 1) == 0) {
        auVar197 = auVar144;
      }
      auVar66 = vmaxss_avx(auVar197,auVar66);
      auVar83 = vminps_avx(auVar83,auVar67);
      auVar67 = vminps_avx(auVar124,auVar142);
      auVar67 = vminps_avx(auVar83,auVar67);
      auVar267 = vshufps_avx(auVar267,auVar267,0x55);
      auVar267 = vblendps_avx(auVar267,auVar130,2);
      auVar130 = vpslld_avx(auVar267,0x1f);
      auVar267 = vshufpd_avx(auVar109,auVar109,1);
      auVar267 = vinsertps_avx(auVar267,auVar182,0x9c);
      auVar83 = vshufpd_avx(auVar204,auVar204,1);
      auVar83 = vinsertps_avx(auVar83,auVar144,0x9c);
      auVar267 = vblendvps_avx(auVar83,auVar267,auVar130);
      auVar83 = vmovshdup_avx(auVar267);
      auVar267 = vmaxss_avx(auVar83,auVar267);
      fVar63 = auVar67._0_4_;
      auVar83 = vmovshdup_avx(auVar67);
      fVar163 = auVar267._0_4_;
      fVar161 = auVar66._0_4_;
      if ((0.0001 <= fVar63) || (fVar163 <= -0.0001)) {
        auVar204 = vcmpps_avx(auVar83,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar109 = vcmpps_avx(auVar67,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar204 = vorps_avx(auVar109,auVar204);
        if ((-0.0001 < fVar161 & auVar204[0]) != 0) goto LAB_01651dd4;
        auVar204 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar267,5);
        auVar109 = vcmpps_avx(auVar83,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar204 = vorps_avx(auVar109,auVar204);
        if ((auVar204 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01651dd4;
LAB_01652880:
        bVar44 = true;
      }
      else {
LAB_01651dd4:
        auVar109 = vcmpps_avx(auVar67,_DAT_01feba10,1);
        auVar130 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar204 = vcmpss_avx(auVar66,ZEXT816(0) << 0x20,1);
        auVar151._8_4_ = 0x3f800000;
        auVar151._0_8_ = &DAT_3f8000003f800000;
        auVar151._12_4_ = 0x3f800000;
        auVar203._8_4_ = 0xbf800000;
        auVar203._0_8_ = 0xbf800000bf800000;
        auVar203._12_4_ = 0xbf800000;
        auVar204 = vblendvps_avx(auVar151,auVar203,auVar204);
        auVar109 = vblendvps_avx(auVar151,auVar203,auVar109);
        fVar65 = auVar109._0_4_;
        fVar141 = auVar204._0_4_;
        auVar204 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar124 = ZEXT816(0) << 0x20;
        if ((fVar65 == fVar141) && (!NAN(fVar65) && !NAN(fVar141))) {
          auVar204 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar65 == fVar141) && (!NAN(fVar65) && !NAN(fVar141))) {
          auVar130 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar109 = vmovshdup_avx(auVar109);
        fVar179 = auVar109._0_4_;
        if ((fVar65 != fVar179) || (NAN(fVar65) || NAN(fVar179))) {
          fVar65 = auVar83._0_4_;
          if ((fVar65 != fVar63) || (NAN(fVar65) || NAN(fVar63))) {
            auVar100._0_4_ = (float)((uint)fVar63 ^ local_348);
            auVar100._4_4_ = auVar67._4_4_ ^ uStack_344;
            auVar100._8_4_ = auVar67._8_4_ ^ uStack_340;
            auVar100._12_4_ = auVar67._12_4_ ^ uStack_33c;
            auVar131._0_4_ = auVar100._0_4_ / (fVar65 - fVar63);
            auVar131._4_12_ = auVar100._4_12_;
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar124,auVar131);
            auVar67 = auVar83;
          }
          else {
            auVar83 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar63 == 0.0) && (auVar83 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar63))) {
              auVar83 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar63 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar63))) {
              auVar67 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar204 = vminss_avx(auVar204,auVar83);
          auVar130 = vmaxss_avx(auVar67,auVar130);
        }
        auVar267 = vcmpss_avx(auVar267,auVar124,1);
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = &DAT_3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar152._8_4_ = 0xbf800000;
        auVar152._0_8_ = 0xbf800000bf800000;
        auVar152._12_4_ = 0xbf800000;
        auVar267 = vblendvps_avx(auVar132,auVar152,auVar267);
        fVar63 = auVar267._0_4_;
        auVar267 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar141 != fVar63) || (NAN(fVar141) || NAN(fVar63))) {
          if ((fVar163 != fVar161) || (NAN(fVar163) || NAN(fVar161))) {
            auVar101._0_4_ = (float)((uint)fVar161 ^ local_348);
            auVar101._4_4_ = auVar66._4_4_ ^ uStack_344;
            auVar101._8_4_ = auVar66._8_4_ ^ uStack_340;
            auVar101._12_4_ = auVar66._12_4_ ^ uStack_33c;
            auVar133._0_4_ = auVar101._0_4_ / (fVar163 - fVar161);
            auVar133._4_12_ = auVar101._4_12_;
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar124,auVar133);
            auVar67 = auVar83;
          }
          else {
            auVar83 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar161 == 0.0) && (auVar83 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar161))) {
              auVar83 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar161 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar161))) {
              auVar67 = auVar267;
            }
          }
          auVar204 = vminss_avx(auVar204,auVar83);
          auVar130 = vmaxss_avx(auVar67,auVar130);
        }
        if ((fVar179 != fVar63) || (NAN(fVar179) || NAN(fVar63))) {
          auVar204 = vminss_avx(auVar204,auVar267);
          auVar130 = vmaxss_avx(auVar267,auVar130);
        }
        auVar83 = vmaxss_avx(auVar124,auVar204);
        auVar67 = vminss_avx(auVar130,auVar267);
        bVar44 = true;
        if (auVar83._0_4_ <= auVar67._0_4_) {
          auVar83 = vmaxss_avx(auVar124,ZEXT416((uint)(auVar83._0_4_ + -0.1)));
          auVar267 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ + 0.1)),auVar267);
          auVar87._0_8_ = auVar125._0_8_;
          auVar87._8_8_ = auVar87._0_8_;
          auVar205._8_8_ = local_218._0_8_;
          auVar205._0_8_ = local_218._0_8_;
          auVar216._8_8_ = auVar143._0_8_;
          auVar216._0_8_ = auVar143._0_8_;
          auVar67 = vshufpd_avx(local_218._0_16_,local_218._0_16_,3);
          auVar204 = vshufpd_avx(auVar143,auVar143,3);
          auVar109 = vshufps_avx(auVar83,auVar267,0);
          auVar113._8_4_ = 0x3f800000;
          auVar113._0_8_ = &DAT_3f8000003f800000;
          auVar113._12_4_ = 0x3f800000;
          auVar125 = vsubps_avx(auVar113,auVar109);
          local_3d8._0_4_ = auVar9._0_4_;
          local_3d8._4_4_ = auVar9._4_4_;
          fStack_3d0 = auVar9._8_4_;
          fStack_3cc = auVar9._12_4_;
          fVar161 = auVar109._0_4_;
          auVar114._0_4_ = fVar161 * (float)local_3d8._0_4_;
          fVar163 = auVar109._4_4_;
          auVar114._4_4_ = fVar163 * (float)local_3d8._4_4_;
          fVar63 = auVar109._8_4_;
          auVar114._8_4_ = fVar63 * fStack_3d0;
          fVar65 = auVar109._12_4_;
          auVar114._12_4_ = fVar65 * fStack_3cc;
          auVar134._0_4_ = auVar67._0_4_ * fVar161;
          auVar134._4_4_ = auVar67._4_4_ * fVar163;
          auVar134._8_4_ = auVar67._8_4_ * fVar63;
          auVar134._12_4_ = auVar67._12_4_ * fVar65;
          auVar153._0_4_ = auVar204._0_4_ * fVar161;
          auVar153._4_4_ = auVar204._4_4_ * fVar163;
          auVar153._8_4_ = auVar204._8_4_ * fVar63;
          auVar153._12_4_ = auVar204._12_4_ * fVar65;
          local_408._0_4_ = auVar95._0_4_;
          local_408._4_4_ = auVar95._4_4_;
          uStack_400._0_4_ = auVar95._8_4_;
          uStack_400._4_4_ = auVar95._12_4_;
          auVar173._0_4_ = fVar161 * (float)local_408._0_4_;
          auVar173._4_4_ = fVar163 * (float)local_408._4_4_;
          auVar173._8_4_ = fVar63 * (float)uStack_400;
          auVar173._12_4_ = fVar65 * uStack_400._4_4_;
          auVar67 = vfmadd231ps_fma(auVar114,auVar125,auVar87);
          auVar204 = vfmadd231ps_fma(auVar134,auVar125,auVar205);
          auVar109 = vfmadd231ps_fma(auVar153,auVar125,auVar216);
          auVar125 = vfmadd231ps_fma(auVar173,auVar125,ZEXT816(0));
          auVar9 = vmovshdup_avx(local_4c8);
          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar83._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar83._0_4_)));
          auVar124 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar267._0_4_)),local_4c8,
                                     ZEXT416((uint)(1.0 - auVar267._0_4_)));
          fVar161 = 1.0 / fVar140;
          auVar267 = vsubps_avx(auVar204,auVar67);
          auVar187._0_4_ = auVar267._0_4_ * 3.0;
          auVar187._4_4_ = auVar267._4_4_ * 3.0;
          auVar187._8_4_ = auVar267._8_4_ * 3.0;
          auVar187._12_4_ = auVar267._12_4_ * 3.0;
          auVar267 = vsubps_avx(auVar109,auVar204);
          auVar206._0_4_ = auVar267._0_4_ * 3.0;
          auVar206._4_4_ = auVar267._4_4_ * 3.0;
          auVar206._8_4_ = auVar267._8_4_ * 3.0;
          auVar206._12_4_ = auVar267._12_4_ * 3.0;
          auVar267 = vsubps_avx(auVar125,auVar109);
          auVar217._0_4_ = auVar267._0_4_ * 3.0;
          auVar217._4_4_ = auVar267._4_4_ * 3.0;
          auVar217._8_4_ = auVar267._8_4_ * 3.0;
          auVar217._12_4_ = auVar267._12_4_ * 3.0;
          auVar9 = vminps_avx(auVar206,auVar217);
          auVar267 = vmaxps_avx(auVar206,auVar217);
          auVar9 = vminps_avx(auVar187,auVar9);
          auVar267 = vmaxps_avx(auVar187,auVar267);
          auVar95 = vshufpd_avx(auVar9,auVar9,3);
          auVar83 = vshufpd_avx(auVar267,auVar267,3);
          auVar9 = vminps_avx(auVar9,auVar95);
          auVar267 = vmaxps_avx(auVar267,auVar83);
          auVar207._0_4_ = auVar9._0_4_ * fVar161;
          auVar207._4_4_ = auVar9._4_4_ * fVar161;
          auVar207._8_4_ = auVar9._8_4_ * fVar161;
          auVar207._12_4_ = auVar9._12_4_ * fVar161;
          auVar188._0_4_ = fVar161 * auVar267._0_4_;
          auVar188._4_4_ = fVar161 * auVar267._4_4_;
          auVar188._8_4_ = fVar161 * auVar267._8_4_;
          auVar188._12_4_ = fVar161 * auVar267._12_4_;
          fVar161 = 1.0 / (auVar124._0_4_ - auVar130._0_4_);
          auVar267 = vshufpd_avx(auVar67,auVar67,3);
          auVar9 = vshufpd_avx(auVar204,auVar204,3);
          auVar95 = vshufpd_avx(auVar109,auVar109,3);
          auVar83 = vshufpd_avx(auVar125,auVar125,3);
          auVar267 = vsubps_avx(auVar267,auVar67);
          auVar67 = vsubps_avx(auVar9,auVar204);
          auVar204 = vsubps_avx(auVar95,auVar109);
          auVar83 = vsubps_avx(auVar83,auVar125);
          auVar9 = vminps_avx(auVar267,auVar67);
          auVar267 = vmaxps_avx(auVar267,auVar67);
          auVar95 = vminps_avx(auVar204,auVar83);
          auVar95 = vminps_avx(auVar9,auVar95);
          auVar9 = vmaxps_avx(auVar204,auVar83);
          auVar267 = vmaxps_avx(auVar267,auVar9);
          auVar236._0_4_ = fVar161 * auVar95._0_4_;
          auVar236._4_4_ = fVar161 * auVar95._4_4_;
          auVar236._8_4_ = fVar161 * auVar95._8_4_;
          auVar236._12_4_ = fVar161 * auVar95._12_4_;
          auVar227._0_4_ = fVar161 * auVar267._0_4_;
          auVar227._4_4_ = fVar161 * auVar267._4_4_;
          auVar227._8_4_ = fVar161 * auVar267._8_4_;
          auVar227._12_4_ = fVar161 * auVar267._12_4_;
          auVar95 = vinsertps_avx(auVar12,auVar130,0x10);
          auVar83 = vinsertps_avx(auVar8,auVar124,0x10);
          auVar80._0_4_ = (auVar95._0_4_ + auVar83._0_4_) * 0.5;
          auVar80._4_4_ = (auVar95._4_4_ + auVar83._4_4_) * 0.5;
          auVar80._8_4_ = (auVar95._8_4_ + auVar83._8_4_) * 0.5;
          auVar80._12_4_ = (auVar95._12_4_ + auVar83._12_4_) * 0.5;
          auVar115._4_4_ = auVar80._0_4_;
          auVar115._0_4_ = auVar80._0_4_;
          auVar115._8_4_ = auVar80._0_4_;
          auVar115._12_4_ = auVar80._0_4_;
          auVar8 = vfmadd213ps_fma(local_228,auVar115,local_478);
          auVar267 = vfmadd213ps_fma(local_238,auVar115,local_488);
          auVar9 = vfmadd213ps_fma(local_248,auVar115,local_498);
          auVar12 = vsubps_avx(auVar267,auVar8);
          auVar8 = vfmadd213ps_fma(auVar12,auVar115,auVar8);
          auVar12 = vsubps_avx(auVar9,auVar267);
          auVar12 = vfmadd213ps_fma(auVar12,auVar115,auVar267);
          auVar12 = vsubps_avx(auVar12,auVar8);
          auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar115);
          auVar116._0_8_ = CONCAT44(auVar12._4_4_ * 3.0,auVar12._0_4_ * 3.0);
          auVar116._8_4_ = auVar12._8_4_ * 3.0;
          auVar116._12_4_ = auVar12._12_4_ * 3.0;
          auVar218._8_8_ = auVar8._0_8_;
          auVar218._0_8_ = auVar8._0_8_;
          auVar12 = vshufpd_avx(auVar8,auVar8,3);
          auVar8 = vshufps_avx(auVar80,auVar80,0x55);
          auVar67 = vsubps_avx(auVar12,auVar218);
          auVar109 = vfmadd231ps_fma(auVar218,auVar8,auVar67);
          auVar257._8_8_ = auVar116._0_8_;
          auVar257._0_8_ = auVar116._0_8_;
          auVar12 = vshufpd_avx(auVar116,auVar116,3);
          auVar12 = vsubps_avx(auVar12,auVar257);
          auVar204 = vfmadd213ps_fma(auVar12,auVar8,auVar257);
          auVar8 = vmovshdup_avx(auVar204);
          auVar258._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
          auVar258._8_4_ = auVar8._8_4_ ^ 0x80000000;
          auVar258._12_4_ = auVar8._12_4_ ^ 0x80000000;
          auVar267 = vmovshdup_avx(auVar67);
          auVar12 = vunpcklps_avx(auVar267,auVar258);
          auVar9 = vshufps_avx(auVar12,auVar258,4);
          auVar275._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
          auVar275._8_4_ = auVar67._8_4_ ^ 0x80000000;
          auVar275._12_4_ = auVar67._12_4_ ^ 0x80000000;
          auVar12 = vmovlhps_avx(auVar275,auVar204);
          auVar12 = vshufps_avx(auVar12,auVar204,8);
          auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar67._0_4_)),auVar267,auVar204);
          auVar135._0_4_ = auVar8._0_4_;
          auVar135._4_4_ = auVar135._0_4_;
          auVar135._8_4_ = auVar135._0_4_;
          auVar135._12_4_ = auVar135._0_4_;
          auVar8 = vdivps_avx(auVar9,auVar135);
          auVar267 = vdivps_avx(auVar12,auVar135);
          fVar63 = auVar109._0_4_;
          fVar161 = auVar8._0_4_;
          auVar12 = vshufps_avx(auVar109,auVar109,0x55);
          fVar163 = auVar267._0_4_;
          local_408._4_4_ = fVar63 * auVar8._4_4_ + auVar12._4_4_ * auVar267._4_4_;
          local_408._0_4_ = fVar63 * fVar161 + auVar12._0_4_ * fVar163;
          uStack_400._0_4_ = fVar63 * auVar8._8_4_ + auVar12._8_4_ * auVar267._8_4_;
          uStack_400._4_4_ = fVar63 * auVar8._12_4_ + auVar12._12_4_ * auVar267._12_4_;
          auVar67 = vmovshdup_avx(auVar8);
          auVar12 = vinsertps_avx(auVar207,auVar236,0x1c);
          auVar268._0_4_ = auVar67._0_4_ * auVar12._0_4_;
          auVar268._4_4_ = auVar67._4_4_ * auVar12._4_4_;
          auVar268._8_4_ = auVar67._8_4_ * auVar12._8_4_;
          auVar268._12_4_ = auVar67._12_4_ * auVar12._12_4_;
          auVar9 = vinsertps_avx(auVar188,auVar227,0x1c);
          auVar245._0_4_ = auVar67._0_4_ * auVar9._0_4_;
          auVar245._4_4_ = auVar67._4_4_ * auVar9._4_4_;
          auVar245._8_4_ = auVar67._8_4_ * auVar9._8_4_;
          auVar245._12_4_ = auVar67._12_4_ * auVar9._12_4_;
          auVar125 = vminps_avx(auVar268,auVar245);
          auVar109 = vmaxps_avx(auVar245,auVar268);
          auVar67 = vinsertps_avx(auVar236,auVar207,0x4c);
          auVar66 = vmovshdup_avx(auVar267);
          auVar204 = vinsertps_avx(auVar227,auVar188,0x4c);
          auVar228._0_4_ = auVar66._0_4_ * auVar67._0_4_;
          auVar228._4_4_ = auVar66._4_4_ * auVar67._4_4_;
          auVar228._8_4_ = auVar66._8_4_ * auVar67._8_4_;
          auVar228._12_4_ = auVar66._12_4_ * auVar67._12_4_;
          auVar237._0_4_ = auVar66._0_4_ * auVar204._0_4_;
          auVar237._4_4_ = auVar66._4_4_ * auVar204._4_4_;
          auVar237._8_4_ = auVar66._8_4_ * auVar204._8_4_;
          auVar237._12_4_ = auVar66._12_4_ * auVar204._12_4_;
          auVar66 = vminps_avx(auVar228,auVar237);
          auVar88._0_4_ = auVar66._0_4_ + auVar125._0_4_;
          auVar88._4_4_ = auVar66._4_4_ + auVar125._4_4_;
          auVar88._8_4_ = auVar66._8_4_ + auVar125._8_4_;
          auVar88._12_4_ = auVar66._12_4_ + auVar125._12_4_;
          auVar125 = vmaxps_avx(auVar237,auVar228);
          auVar229._0_4_ = auVar109._0_4_ + auVar125._0_4_;
          auVar229._4_4_ = auVar109._4_4_ + auVar125._4_4_;
          auVar229._8_4_ = auVar109._8_4_ + auVar125._8_4_;
          auVar229._12_4_ = auVar109._12_4_ + auVar125._12_4_;
          auVar238._8_8_ = 0x3f80000000000000;
          auVar238._0_8_ = 0x3f80000000000000;
          auVar109 = vsubps_avx(auVar238,auVar229);
          auVar125 = vsubps_avx(auVar238,auVar88);
          auVar66 = vsubps_avx(auVar95,auVar80);
          auVar259._0_4_ = fVar161 * auVar12._0_4_;
          auVar259._4_4_ = fVar161 * auVar12._4_4_;
          auVar259._8_4_ = fVar161 * auVar12._8_4_;
          auVar259._12_4_ = fVar161 * auVar12._12_4_;
          auVar246._0_4_ = fVar161 * auVar9._0_4_;
          auVar246._4_4_ = fVar161 * auVar9._4_4_;
          auVar246._8_4_ = fVar161 * auVar9._8_4_;
          auVar246._12_4_ = fVar161 * auVar9._12_4_;
          auVar9 = vminps_avx(auVar259,auVar246);
          auVar12 = vmaxps_avx(auVar246,auVar259);
          auVar208._0_4_ = fVar163 * auVar67._0_4_;
          auVar208._4_4_ = fVar163 * auVar67._4_4_;
          auVar208._8_4_ = fVar163 * auVar67._8_4_;
          auVar208._12_4_ = fVar163 * auVar67._12_4_;
          auVar189._0_4_ = fVar163 * auVar204._0_4_;
          auVar189._4_4_ = fVar163 * auVar204._4_4_;
          auVar189._8_4_ = fVar163 * auVar204._8_4_;
          auVar189._12_4_ = fVar163 * auVar204._12_4_;
          auVar67 = vminps_avx(auVar208,auVar189);
          auVar260._0_4_ = auVar9._0_4_ + auVar67._0_4_;
          auVar260._4_4_ = auVar9._4_4_ + auVar67._4_4_;
          auVar260._8_4_ = auVar9._8_4_ + auVar67._8_4_;
          auVar260._12_4_ = auVar9._12_4_ + auVar67._12_4_;
          auVar67 = vsubps_avx(auVar83,auVar80);
          auVar9 = vmaxps_avx(auVar189,auVar208);
          fVar63 = auVar66._0_4_;
          auVar209._0_4_ = fVar63 * auVar109._0_4_;
          fVar65 = auVar66._4_4_;
          auVar209._4_4_ = fVar65 * auVar109._4_4_;
          fVar141 = auVar66._8_4_;
          auVar209._8_4_ = fVar141 * auVar109._8_4_;
          fVar179 = auVar66._12_4_;
          auVar209._12_4_ = fVar179 * auVar109._12_4_;
          auVar190._0_4_ = auVar12._0_4_ + auVar9._0_4_;
          auVar190._4_4_ = auVar12._4_4_ + auVar9._4_4_;
          auVar190._8_4_ = auVar12._8_4_ + auVar9._8_4_;
          auVar190._12_4_ = auVar12._12_4_ + auVar9._12_4_;
          auVar247._8_8_ = 0x3f800000;
          auVar247._0_8_ = 0x3f800000;
          auVar12 = vsubps_avx(auVar247,auVar190);
          auVar9 = vsubps_avx(auVar247,auVar260);
          auVar261._0_4_ = fVar63 * auVar125._0_4_;
          auVar261._4_4_ = fVar65 * auVar125._4_4_;
          auVar261._8_4_ = fVar141 * auVar125._8_4_;
          auVar261._12_4_ = fVar179 * auVar125._12_4_;
          fVar139 = auVar67._0_4_;
          auVar230._0_4_ = fVar139 * auVar109._0_4_;
          fVar158 = auVar67._4_4_;
          auVar230._4_4_ = fVar158 * auVar109._4_4_;
          fVar160 = auVar67._8_4_;
          auVar230._8_4_ = fVar160 * auVar109._8_4_;
          fVar162 = auVar67._12_4_;
          auVar230._12_4_ = fVar162 * auVar109._12_4_;
          auVar89._0_4_ = fVar139 * auVar125._0_4_;
          auVar89._4_4_ = fVar158 * auVar125._4_4_;
          auVar89._8_4_ = fVar160 * auVar125._8_4_;
          auVar89._12_4_ = fVar162 * auVar125._12_4_;
          auVar276._0_4_ = fVar63 * auVar12._0_4_;
          auVar276._4_4_ = fVar65 * auVar12._4_4_;
          auVar276._8_4_ = fVar141 * auVar12._8_4_;
          auVar276._12_4_ = fVar179 * auVar12._12_4_;
          auVar239._0_4_ = fVar63 * auVar9._0_4_;
          auVar239._4_4_ = fVar65 * auVar9._4_4_;
          auVar239._8_4_ = fVar141 * auVar9._8_4_;
          auVar239._12_4_ = fVar179 * auVar9._12_4_;
          auVar191._0_4_ = fVar139 * auVar12._0_4_;
          auVar191._4_4_ = fVar158 * auVar12._4_4_;
          auVar191._8_4_ = fVar160 * auVar12._8_4_;
          auVar191._12_4_ = fVar162 * auVar12._12_4_;
          auVar248._0_4_ = fVar139 * auVar9._0_4_;
          auVar248._4_4_ = fVar158 * auVar9._4_4_;
          auVar248._8_4_ = fVar160 * auVar9._8_4_;
          auVar248._12_4_ = fVar162 * auVar9._12_4_;
          auVar12 = vminps_avx(auVar276,auVar239);
          auVar9 = vminps_avx(auVar191,auVar248);
          auVar12 = vminps_avx(auVar12,auVar9);
          auVar9 = vmaxps_avx(auVar239,auVar276);
          auVar67 = vminps_avx(auVar209,auVar261);
          auVar204 = vminps_avx(auVar230,auVar89);
          auVar67 = vminps_avx(auVar67,auVar204);
          auVar12 = vhaddps_avx(auVar12,auVar67);
          auVar67 = vmaxps_avx(auVar248,auVar191);
          auVar9 = vmaxps_avx(auVar67,auVar9);
          auVar67 = vmaxps_avx(auVar261,auVar209);
          auVar204 = vmaxps_avx(auVar89,auVar230);
          auVar67 = vmaxps_avx(auVar204,auVar67);
          auVar9 = vhaddps_avx(auVar9,auVar67);
          auVar67 = vshufps_avx(auVar80,auVar80,0x54);
          auVar67 = vsubps_avx(auVar67,_local_408);
          auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
          auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
          auVar210._0_4_ = auVar67._0_4_ + auVar12._0_4_;
          auVar210._4_4_ = auVar67._4_4_ + auVar12._4_4_;
          auVar210._8_4_ = auVar67._8_4_ + auVar12._8_4_;
          auVar210._12_4_ = auVar67._12_4_ + auVar12._12_4_;
          auVar192._0_4_ = auVar67._0_4_ + auVar9._0_4_;
          auVar192._4_4_ = auVar67._4_4_ + auVar9._4_4_;
          auVar192._8_4_ = auVar67._8_4_ + auVar9._8_4_;
          auVar192._12_4_ = auVar67._12_4_ + auVar9._12_4_;
          auVar12 = vmaxps_avx(auVar95,auVar210);
          auVar9 = vminps_avx(auVar192,auVar83);
          auVar12 = vcmpps_avx(auVar9,auVar12,1);
          auVar12 = vshufps_avx(auVar12,auVar12,0x50);
          local_4c8 = vinsertps_avx(auVar130,ZEXT416((uint)auVar124._0_4_),0x10);
          if ((auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar12[0xf] < '\0') goto LAB_01652880;
          bVar60 = 0;
          if ((fVar159 < auVar210._0_4_) && (auVar192._0_4_ < auVar83._0_4_)) {
            auVar9 = vmovshdup_avx(auVar210);
            auVar12 = vcmpps_avx(auVar192,auVar83,1);
            bVar60 = auVar12[4] & auVar130._0_4_ < auVar9._0_4_;
          }
          if (((3 < (uint)uVar56 || fVar140 < 0.001) | bVar60) == 1) {
            lVar58 = 200;
            do {
              fVar65 = auVar67._0_4_;
              fVar63 = 1.0 - fVar65;
              fVar140 = fVar63 * fVar63 * fVar63;
              fVar159 = fVar65 * 3.0 * fVar63 * fVar63;
              fVar63 = fVar63 * fVar65 * fVar65 * 3.0;
              auVar154._4_4_ = fVar140;
              auVar154._0_4_ = fVar140;
              auVar154._8_4_ = fVar140;
              auVar154._12_4_ = fVar140;
              auVar102._4_4_ = fVar159;
              auVar102._0_4_ = fVar159;
              auVar102._8_4_ = fVar159;
              auVar102._12_4_ = fVar159;
              auVar90._4_4_ = fVar63;
              auVar90._0_4_ = fVar63;
              auVar90._8_4_ = fVar63;
              auVar90._12_4_ = fVar63;
              fVar65 = fVar65 * fVar65 * fVar65;
              auVar174._0_4_ = (float)local_258._0_4_ * fVar65;
              auVar174._4_4_ = (float)local_258._4_4_ * fVar65;
              auVar174._8_4_ = fStack_250 * fVar65;
              auVar174._12_4_ = fStack_24c * fVar65;
              auVar12 = vfmadd231ps_fma(auVar174,local_498,auVar90);
              auVar12 = vfmadd231ps_fma(auVar12,local_488,auVar102);
              auVar12 = vfmadd231ps_fma(auVar12,local_478,auVar154);
              auVar91._8_8_ = auVar12._0_8_;
              auVar91._0_8_ = auVar12._0_8_;
              auVar12 = vshufpd_avx(auVar12,auVar12,3);
              auVar9 = vshufps_avx(auVar67,auVar67,0x55);
              auVar12 = vsubps_avx(auVar12,auVar91);
              auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar91);
              fVar140 = auVar9._0_4_;
              auVar12 = vshufps_avx(auVar9,auVar9,0x55);
              auVar92._0_4_ = fVar161 * fVar140 + fVar163 * auVar12._0_4_;
              auVar92._4_4_ = auVar8._4_4_ * fVar140 + auVar267._4_4_ * auVar12._4_4_;
              auVar92._8_4_ = auVar8._8_4_ * fVar140 + auVar267._8_4_ * auVar12._8_4_;
              auVar92._12_4_ = auVar8._12_4_ * fVar140 + auVar267._12_4_ * auVar12._12_4_;
              auVar67 = vsubps_avx(auVar67,auVar92);
              auVar12 = vandps_avx(local_338,auVar9);
              auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
              auVar12 = vmaxss_avx(auVar9,auVar12);
              if (auVar12._0_4_ < (float)local_428._0_4_) {
                fVar140 = auVar67._0_4_;
                if ((0.0 <= fVar140) && (fVar140 <= 1.0)) {
                  auVar12 = vmovshdup_avx(auVar67);
                  fVar159 = auVar12._0_4_;
                  if ((0.0 <= fVar159) && (fVar159 <= 1.0)) {
                    auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar109 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                   [2]),0x28);
                    aVar1 = (ray->super_RayK<1>).org.field_0;
                    auVar12 = vsubps_avx(local_358,(undefined1  [16])aVar1);
                    auVar12 = vdpps_avx(auVar12,auVar109,0x7f);
                    auVar8 = vsubps_avx(local_388,(undefined1  [16])aVar1);
                    auVar8 = vdpps_avx(auVar8,auVar109,0x7f);
                    auVar267 = vsubps_avx(local_398,(undefined1  [16])aVar1);
                    auVar267 = vdpps_avx(auVar267,auVar109,0x7f);
                    auVar9 = vsubps_avx(local_378,(undefined1  [16])aVar1);
                    auVar9 = vdpps_avx(auVar9,auVar109,0x7f);
                    auVar95 = vsubps_avx(_local_368,(undefined1  [16])aVar1);
                    auVar95 = vdpps_avx(auVar95,auVar109,0x7f);
                    auVar83 = vsubps_avx(_local_3a8,(undefined1  [16])aVar1);
                    auVar83 = vdpps_avx(auVar83,auVar109,0x7f);
                    auVar204 = vsubps_avx(_local_3b8,(undefined1  [16])aVar1);
                    auVar204 = vdpps_avx(auVar204,auVar109,0x7f);
                    auVar49._4_4_ = fStack_3e4;
                    auVar49._0_4_ = local_3e8;
                    auVar49._8_4_ = fStack_3e0;
                    auVar49._12_4_ = fStack_3dc;
                    auVar125 = vsubps_avx(auVar49,(undefined1  [16])aVar1);
                    auVar109 = vdpps_avx(auVar125,auVar109,0x7f);
                    fVar161 = 1.0 - fVar159;
                    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ * fVar159)),
                                              ZEXT416((uint)fVar161),auVar12);
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar159)),
                                             ZEXT416((uint)fVar161),auVar8);
                    auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar204._0_4_ * fVar159)),
                                               ZEXT416((uint)fVar161),auVar267);
                    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * auVar109._0_4_)),
                                             ZEXT416((uint)fVar161),auVar9);
                    fVar63 = 1.0 - fVar140;
                    fVar159 = fVar63 * fVar140 * fVar140 * 3.0;
                    fVar141 = fVar140 * fVar140 * fVar140;
                    auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar141)),
                                               ZEXT416((uint)fVar159),auVar267);
                    fVar161 = fVar140 * 3.0 * fVar63 * fVar63;
                    auVar8 = vfmadd231ss_fma(auVar267,ZEXT416((uint)fVar161),auVar8);
                    fVar163 = fVar63 * fVar63 * fVar63;
                    auVar12 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar163),auVar12);
                    fVar65 = auVar12._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar65) {
                      fVar179 = (ray->super_RayK<1>).tfar;
                      local_408._0_4_ = fVar179;
                      if ((fVar65 <= fVar179) &&
                         (pGVar4 = (context->scene->geometries).items[uVar53].ptr,
                         (pGVar4->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar12 = vshufps_avx(auVar67,auVar67,0x55);
                        auVar211._8_4_ = 0x3f800000;
                        auVar211._0_8_ = &DAT_3f8000003f800000;
                        auVar211._12_4_ = 0x3f800000;
                        auVar8 = vsubps_avx(auVar211,auVar12);
                        fVar179 = auVar12._0_4_;
                        auVar219._0_4_ = fVar179 * (float)local_368._0_4_;
                        fVar139 = auVar12._4_4_;
                        auVar219._4_4_ = fVar139 * (float)local_368._4_4_;
                        fVar158 = auVar12._8_4_;
                        auVar219._8_4_ = fVar158 * fStack_360;
                        fVar160 = auVar12._12_4_;
                        auVar219._12_4_ = fVar160 * fStack_35c;
                        auVar231._0_4_ = fVar179 * (float)local_3a8._0_4_;
                        auVar231._4_4_ = fVar139 * (float)local_3a8._4_4_;
                        auVar231._8_4_ = fVar158 * fStack_3a0;
                        auVar231._12_4_ = fVar160 * fStack_39c;
                        auVar240._0_4_ = fVar179 * (float)local_3b8._0_4_;
                        auVar240._4_4_ = fVar139 * (float)local_3b8._4_4_;
                        auVar240._8_4_ = fVar158 * fStack_3b0;
                        auVar240._12_4_ = fVar160 * fStack_3ac;
                        auVar193._0_4_ = fVar179 * local_3e8;
                        auVar193._4_4_ = fVar139 * fStack_3e4;
                        auVar193._8_4_ = fVar158 * fStack_3e0;
                        auVar193._12_4_ = fVar160 * fStack_3dc;
                        auVar12 = vfmadd231ps_fma(auVar219,auVar8,local_358);
                        auVar267 = vfmadd231ps_fma(auVar231,auVar8,local_388);
                        auVar9 = vfmadd231ps_fma(auVar240,auVar8,local_398);
                        auVar95 = vfmadd231ps_fma(auVar193,auVar8,local_378);
                        auVar12 = vsubps_avx(auVar267,auVar12);
                        auVar8 = vsubps_avx(auVar9,auVar267);
                        auVar267 = vsubps_avx(auVar95,auVar9);
                        auVar241._0_4_ = fVar140 * auVar8._0_4_;
                        auVar241._4_4_ = fVar140 * auVar8._4_4_;
                        auVar241._8_4_ = fVar140 * auVar8._8_4_;
                        auVar241._12_4_ = fVar140 * auVar8._12_4_;
                        auVar175._4_4_ = fVar63;
                        auVar175._0_4_ = fVar63;
                        auVar175._8_4_ = fVar63;
                        auVar175._12_4_ = fVar63;
                        auVar12 = vfmadd231ps_fma(auVar241,auVar175,auVar12);
                        auVar194._0_4_ = fVar140 * auVar267._0_4_;
                        auVar194._4_4_ = fVar140 * auVar267._4_4_;
                        auVar194._8_4_ = fVar140 * auVar267._8_4_;
                        auVar194._12_4_ = fVar140 * auVar267._12_4_;
                        auVar8 = vfmadd231ps_fma(auVar194,auVar175,auVar8);
                        auVar195._0_4_ = fVar140 * auVar8._0_4_;
                        auVar195._4_4_ = fVar140 * auVar8._4_4_;
                        auVar195._8_4_ = fVar140 * auVar8._8_4_;
                        auVar195._12_4_ = fVar140 * auVar8._12_4_;
                        auVar8 = vfmadd231ps_fma(auVar195,auVar175,auVar12);
                        auVar155._0_4_ = fVar141 * (float)local_2a8._0_4_;
                        auVar155._4_4_ = fVar141 * (float)local_2a8._4_4_;
                        auVar155._8_4_ = fVar141 * fStack_2a0;
                        auVar155._12_4_ = fVar141 * fStack_29c;
                        auVar103._4_4_ = fVar159;
                        auVar103._0_4_ = fVar159;
                        auVar103._8_4_ = fVar159;
                        auVar103._12_4_ = fVar159;
                        auVar12 = vfmadd132ps_fma(auVar103,auVar155,local_298);
                        auVar136._4_4_ = fVar161;
                        auVar136._0_4_ = fVar161;
                        auVar136._8_4_ = fVar161;
                        auVar136._12_4_ = fVar161;
                        auVar12 = vfmadd132ps_fma(auVar136,auVar12,local_288);
                        auVar156._0_4_ = auVar8._0_4_ * 3.0;
                        auVar156._4_4_ = auVar8._4_4_ * 3.0;
                        auVar156._8_4_ = auVar8._8_4_ * 3.0;
                        auVar156._12_4_ = auVar8._12_4_ * 3.0;
                        auVar117._4_4_ = fVar163;
                        auVar117._0_4_ = fVar163;
                        auVar117._8_4_ = fVar163;
                        auVar117._12_4_ = fVar163;
                        auVar8 = vfmadd132ps_fma(auVar117,auVar12,local_278);
                        auVar12 = vshufps_avx(auVar156,auVar156,0xc9);
                        auVar104._0_4_ = auVar8._0_4_ * auVar12._0_4_;
                        auVar104._4_4_ = auVar8._4_4_ * auVar12._4_4_;
                        auVar104._8_4_ = auVar8._8_4_ * auVar12._8_4_;
                        auVar104._12_4_ = auVar8._12_4_ * auVar12._12_4_;
                        auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
                        auVar12 = vfmsub231ps_fma(auVar104,auVar156,auVar12);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar65;
                          auVar8 = vshufps_avx(auVar12,auVar12,0xe9);
                          uVar164 = vmovlps_avx(auVar8);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar164;
                          (ray->Ng).field_0.field_0.z = auVar12._0_4_;
                          uVar164 = vmovlps_avx(auVar67);
                          ray->u = (float)(int)uVar164;
                          ray->v = (float)(int)((ulong)uVar164 >> 0x20);
                          ray->primID = (uint)local_410;
                          ray->geomID = uVar53;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar8 = vshufps_avx(auVar12,auVar12,0xe9);
                          local_2e8 = vmovlps_avx(auVar8);
                          local_2e0 = auVar12._0_4_;
                          local_2dc = vmovlps_avx(auVar67);
                          local_2d4 = (uint)local_410;
                          local_2d0 = uVar53;
                          local_2cc = context->user->instID[0];
                          local_2c8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar65;
                          local_49c = -1;
                          local_328.valid = &local_49c;
                          local_328.geometryUserPtr = pGVar4->userPtr;
                          local_328.context = context->user;
                          local_328.ray = (RTCRayN *)ray;
                          local_328.hit = (RTCHitN *)&local_2e8;
                          local_328.N = 1;
                          if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*pGVar4->intersectionFilterN)(&local_328), *local_328.valid != 0)) {
                            p_Var5 = context->args->filter;
                            if (p_Var5 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var5)(&local_328);
                              }
                              if (*local_328.valid == 0) goto LAB_01652aac;
                            }
                            (((Vec3f *)((long)local_328.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_328.hit;
                            (((Vec3f *)((long)local_328.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_328.hit + 4);
                            (((Vec3f *)((long)local_328.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_328.hit + 8);
                            *(float *)((long)local_328.ray + 0x3c) = *(float *)(local_328.hit + 0xc)
                            ;
                            *(float *)((long)local_328.ray + 0x40) =
                                 *(float *)(local_328.hit + 0x10);
                            *(float *)((long)local_328.ray + 0x44) =
                                 *(float *)(local_328.hit + 0x14);
                            *(float *)((long)local_328.ray + 0x48) =
                                 *(float *)(local_328.hit + 0x18);
                            *(float *)((long)local_328.ray + 0x4c) =
                                 *(float *)(local_328.hit + 0x1c);
                            *(float *)((long)local_328.ray + 0x50) =
                                 *(float *)(local_328.hit + 0x20);
                          }
                          else {
LAB_01652aac:
                            (ray->super_RayK<1>).tfar = (float)local_408._0_4_;
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
          }
          else {
            bVar44 = false;
          }
        }
      }
      auVar271 = ZEXT464(0x3f800000);
      auVar12 = local_448._0_16_;
    } while (bVar44);
    local_448._0_16_ = auVar12;
    local_268 = vinsertps_avx(local_448._0_16_,ZEXT416((uint)local_468),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }